

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O2

void embree::avx512::
     BVHNIntersectorKHybrid<4,_8,_16777232,_true,_embree::avx512::ArrayIntersectorK_1<8,_embree::avx512::QuadMiMBIntersectorKPluecker<4,_8,_true>_>,_true>
     ::occluded(vint<8> *valid_i,Intersectors *This,RayK<8> *ray,RayQueryContext *context)

{
  undefined4 uVar1;
  BBox1f BVar2;
  undefined4 uVar3;
  float fVar4;
  float fVar5;
  Geometry *pGVar6;
  RTCRayQueryContext *pRVar7;
  RTCFilterFunctionN p_Var8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  float fVar16;
  ulong uVar17;
  undefined8 uVar18;
  undefined8 uVar19;
  undefined8 uVar20;
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  float fVar59;
  float fVar60;
  float fVar61;
  float fVar62;
  float fVar63;
  float fVar64;
  undefined4 uVar65;
  undefined4 uVar66;
  undefined4 uVar67;
  undefined4 uVar68;
  undefined4 uVar69;
  undefined4 uVar70;
  undefined4 uVar71;
  undefined4 uVar72;
  undefined4 uVar73;
  undefined4 uVar74;
  undefined4 uVar75;
  undefined4 uVar76;
  undefined4 uVar77;
  undefined4 uVar78;
  undefined4 uVar79;
  undefined4 uVar80;
  undefined4 uVar81;
  undefined4 uVar82;
  undefined4 uVar83;
  undefined4 uVar84;
  undefined4 uVar85;
  undefined4 uVar86;
  undefined4 uVar87;
  undefined4 uVar88;
  undefined4 uVar89;
  undefined4 uVar90;
  undefined4 uVar91;
  undefined4 uVar92;
  undefined4 uVar93;
  undefined4 uVar94;
  undefined4 uVar95;
  undefined4 uVar96;
  undefined4 uVar97;
  undefined4 uVar98;
  undefined4 uVar99;
  undefined4 uVar100;
  byte bVar101;
  bool bVar102;
  int iVar103;
  AABBNodeMB4D *node1;
  ulong uVar104;
  ulong uVar105;
  long lVar106;
  long lVar107;
  undefined1 (*pauVar108) [32];
  long lVar109;
  ulong uVar110;
  vuint<4> *v;
  long lVar111;
  QuadMesh *mesh;
  undefined1 auVar117 [16];
  ulong *puVar112;
  uint uVar113;
  NodeRef root;
  byte bVar114;
  ulong uVar115;
  ulong uVar116;
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  undefined1 auVar118 [16];
  vfloat_impl<8> vVar144;
  vfloat_impl<8> vVar145;
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  vfloat_impl<8> vVar149;
  vfloat_impl<8> vVar150;
  vfloat_impl<8> vVar151;
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  undefined1 auVar155 [32];
  float fVar156;
  float fVar160;
  float fVar161;
  undefined1 auVar157 [16];
  float fVar162;
  float fVar163;
  float fVar164;
  float fVar165;
  undefined1 auVar158 [32];
  undefined1 auVar159 [32];
  undefined1 auVar166 [16];
  undefined1 auVar167 [32];
  undefined1 in_ZMM2 [64];
  float fVar168;
  float fVar172;
  float fVar173;
  float fVar174;
  float fVar175;
  float fVar176;
  float fVar177;
  undefined1 auVar169 [32];
  undefined1 auVar170 [32];
  undefined1 auVar171 [32];
  float fVar178;
  undefined1 auVar179 [32];
  undefined1 auVar180 [32];
  float fVar182;
  float fVar183;
  float fVar184;
  float fVar185;
  float fVar186;
  float fVar187;
  undefined1 auVar181 [64];
  undefined1 auVar188 [32];
  undefined1 auVar189 [32];
  undefined1 auVar190 [32];
  undefined1 auVar191 [32];
  undefined1 auVar193 [16];
  float fVar192;
  undefined1 auVar194 [32];
  undefined1 auVar195 [32];
  float fVar196;
  float fVar197;
  float fVar198;
  float fVar199;
  float fVar200;
  float fVar201;
  undefined1 in_ZMM7 [64];
  undefined1 auVar202 [32];
  undefined1 auVar203 [32];
  float fVar204;
  undefined1 auVar205 [16];
  undefined1 in_ZMM10 [64];
  float fVar206;
  float fVar207;
  float fVar208;
  float fVar209;
  float fVar210;
  float fVar211;
  float fVar212;
  float fVar213;
  undefined1 in_ZMM11 [64];
  undefined1 auVar214 [32];
  undefined1 in_ZMM12 [64];
  undefined1 in_ZMM13 [64];
  undefined1 in_ZMM14 [64];
  undefined1 auVar215 [64];
  undefined1 in_ZMM15 [64];
  undefined1 auVar216 [64];
  undefined1 auVar217 [64];
  undefined1 auVar218 [64];
  undefined1 auVar219 [64];
  undefined1 auVar220 [64];
  undefined1 auVar221 [64];
  undefined1 auVar222 [64];
  undefined1 auVar223 [64];
  undefined1 auVar224 [64];
  Precalculations pre;
  vint<8> itime;
  Vec3<embree::vfloat_impl<8>_> p1;
  Vec3<embree::vfloat_impl<8>_> p0;
  vfloat<8> t;
  vfloat<8> v_1;
  vfloat<8> u;
  TravRayK<8,_true> tray;
  NodeRef stack_node [241];
  vfloat<8> stack_near [241];
  uint local_2c04;
  uint local_2bd8;
  Precalculations local_2bd1;
  ulong local_2bd0;
  ulong local_2bc8;
  RTCFilterFunctionNArguments local_2bc0;
  ulong local_2b78;
  RayK<8> *local_2b70;
  undefined4 local_2b64;
  undefined1 local_2b60 [32];
  undefined1 local_2b40 [32];
  Geometry *local_2b18;
  undefined1 (*local_2b10) [32];
  long local_2b08;
  float local_2b00 [4];
  float fStack_2af0;
  float fStack_2aec;
  float fStack_2ae8;
  undefined4 uStack_2ae4;
  float local_2ae0 [4];
  float fStack_2ad0;
  float fStack_2acc;
  float fStack_2ac8;
  undefined4 uStack_2ac4;
  float local_2ac0 [4];
  float fStack_2ab0;
  float fStack_2aac;
  float fStack_2aa8;
  undefined4 uStack_2aa4;
  undefined1 local_2aa0 [32];
  undefined1 local_2a80 [32];
  BVH *local_2a60;
  Intersectors *local_2a58;
  long local_2a50;
  ulong local_2a48;
  anon_union_96_2_4062524c_for_Vec3<embree::vfloat_impl<8>_>_1 local_2a40;
  undefined1 local_29e0 [32];
  undefined1 local_29c0 [32];
  undefined1 local_29a0 [32];
  undefined1 local_2980 [32];
  uint local_2960;
  uint uStack_295c;
  uint uStack_2958;
  uint uStack_2954;
  uint uStack_2950;
  uint uStack_294c;
  uint uStack_2948;
  uint uStack_2944;
  uint local_2940;
  uint uStack_293c;
  uint uStack_2938;
  uint uStack_2934;
  uint uStack_2930;
  uint uStack_292c;
  uint uStack_2928;
  uint uStack_2924;
  undefined1 local_2920 [32];
  undefined1 local_2900 [32];
  undefined1 local_28e0 [32];
  undefined1 local_28c0 [32];
  undefined1 local_28a0 [8];
  float fStack_2898;
  float fStack_2894;
  float fStack_2890;
  float fStack_288c;
  float fStack_2888;
  float fStack_2884;
  undefined1 local_2880 [8];
  float fStack_2878;
  float fStack_2874;
  float fStack_2870;
  float fStack_286c;
  float fStack_2868;
  float fStack_2864;
  undefined1 local_2860 [8];
  float fStack_2858;
  float fStack_2854;
  float fStack_2850;
  float fStack_284c;
  float fStack_2848;
  float fStack_2844;
  anon_union_96_2_4062524c_for_Vec3<embree::vfloat_impl<8>_>_1 local_2840;
  undefined1 local_27e0 [32];
  undefined1 local_27c0 [32];
  undefined1 local_27a0 [32];
  undefined1 local_2780 [32];
  undefined1 local_2760 [8];
  float fStack_2758;
  float fStack_2754;
  float fStack_2750;
  float fStack_274c;
  float fStack_2748;
  undefined4 uStack_2744;
  undefined1 local_2740 [8];
  float fStack_2738;
  float fStack_2734;
  float fStack_2730;
  float fStack_272c;
  float fStack_2728;
  undefined4 uStack_2724;
  int local_2720;
  int iStack_271c;
  int iStack_2718;
  int iStack_2714;
  int iStack_2710;
  int iStack_270c;
  int iStack_2708;
  int iStack_2704;
  uint local_2700;
  uint uStack_26fc;
  uint uStack_26f8;
  uint uStack_26f4;
  uint uStack_26f0;
  uint uStack_26ec;
  uint uStack_26e8;
  uint uStack_26e4;
  uint local_26e0;
  uint uStack_26dc;
  uint uStack_26d8;
  uint uStack_26d4;
  uint uStack_26d0;
  uint uStack_26cc;
  uint uStack_26c8;
  uint uStack_26c4;
  undefined1 local_26c0 [32];
  undefined1 local_26a0 [32];
  undefined1 local_2680 [32];
  undefined1 local_2660 [32];
  undefined1 local_2640 [32];
  undefined8 local_2610;
  size_t local_2608;
  ulong local_2600 [240];
  undefined1 local_1e80 [32];
  undefined1 local_1e60 [32];
  undefined1 local_1e40 [7696];
  vfloat_impl<8> vVar143;
  
  local_2608 = (((BVH *)This->ptr)->root).ptr;
  if (local_2608 != 8) {
    auVar119 = vpcmpeqd_avx2(in_ZMM2._0_32_,in_ZMM2._0_32_);
    auVar117 = ZEXT816(0) << 0x40;
    uVar115 = vcmpps_avx512vl(*(undefined1 (*) [32])(ray + 0x100),ZEXT1632(auVar117),5);
    uVar105 = vpcmpeqd_avx512vl(auVar119,(undefined1  [32])valid_i->field_0);
    uVar115 = uVar115 & uVar105;
    bVar101 = (byte)uVar115;
    if (bVar101 != 0) {
      local_2840._0_8_ = *(undefined8 *)ray;
      local_2840._8_8_ = *(undefined8 *)(ray + 8);
      local_2840._16_8_ = *(undefined8 *)(ray + 0x10);
      local_2840._24_8_ = *(undefined8 *)(ray + 0x18);
      local_2840._32_8_ = *(undefined8 *)(ray + 0x20);
      local_2840._40_8_ = *(undefined8 *)(ray + 0x28);
      local_2840._48_8_ = *(undefined8 *)(ray + 0x30);
      local_2840._56_8_ = *(undefined8 *)(ray + 0x38);
      local_2840._64_8_ = *(undefined8 *)(ray + 0x40);
      local_2840._72_8_ = *(undefined8 *)(ray + 0x48);
      local_2840._80_8_ = *(undefined8 *)(ray + 0x50);
      local_2840._88_8_ = *(undefined8 *)(ray + 0x58);
      local_27e0 = *(undefined1 (*) [32])(ray + 0x80);
      local_27c0 = *(undefined1 (*) [32])(ray + 0xa0);
      local_27a0 = *(undefined1 (*) [32])(ray + 0xc0);
      auVar119 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      auVar220 = ZEXT3264(auVar119);
      vandps_avx512vl(local_27e0,auVar119);
      auVar123._8_4_ = 0x219392ef;
      auVar123._0_8_ = 0x219392ef219392ef;
      auVar123._12_4_ = 0x219392ef;
      auVar123._16_4_ = 0x219392ef;
      auVar123._20_4_ = 0x219392ef;
      auVar123._24_4_ = 0x219392ef;
      auVar123._28_4_ = 0x219392ef;
      uVar105 = vcmpps_avx512vl(auVar119,auVar123,1);
      auVar120 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
      auVar221 = ZEXT3264(auVar120);
      auVar121 = vdivps_avx512vl(auVar120,local_27e0);
      vandps_avx512vl(local_27c0,auVar119);
      uVar104 = vcmpps_avx512vl(auVar121,auVar123,1);
      auVar122 = vdivps_avx512vl(auVar120,local_27c0);
      vandps_avx512vl(local_27a0,auVar119);
      uVar116 = vcmpps_avx512vl(auVar122,auVar123,1);
      auVar119 = vdivps_avx512vl(auVar120,local_27a0);
      bVar102 = (bool)((byte)uVar105 & 1);
      local_2780._0_4_ = (uint)bVar102 * 0x5d5e0b6b | (uint)!bVar102 * auVar121._0_4_;
      bVar102 = (bool)((byte)(uVar105 >> 1) & 1);
      local_2780._4_4_ = (uint)bVar102 * 0x5d5e0b6b | (uint)!bVar102 * auVar121._4_4_;
      bVar102 = (bool)((byte)(uVar105 >> 2) & 1);
      local_2780._8_4_ = (uint)bVar102 * 0x5d5e0b6b | (uint)!bVar102 * auVar121._8_4_;
      bVar102 = (bool)((byte)(uVar105 >> 3) & 1);
      local_2780._12_4_ = (uint)bVar102 * 0x5d5e0b6b | (uint)!bVar102 * auVar121._12_4_;
      bVar102 = (bool)((byte)(uVar105 >> 4) & 1);
      local_2780._16_4_ = (uint)bVar102 * 0x5d5e0b6b | (uint)!bVar102 * auVar121._16_4_;
      bVar102 = (bool)((byte)(uVar105 >> 5) & 1);
      local_2780._20_4_ = (uint)bVar102 * 0x5d5e0b6b | (uint)!bVar102 * auVar121._20_4_;
      bVar102 = (bool)((byte)(uVar105 >> 6) & 1);
      local_2780._24_4_ = (uint)bVar102 * 0x5d5e0b6b | (uint)!bVar102 * auVar121._24_4_;
      bVar102 = SUB81(uVar105 >> 7,0);
      local_2780._28_4_ = (uint)bVar102 * 0x5d5e0b6b | (uint)!bVar102 * auVar121._28_4_;
      bVar102 = (bool)((byte)uVar104 & 1);
      local_2760._0_4_ = (uint)bVar102 * 0x5d5e0b6b | (uint)!bVar102 * auVar122._0_4_;
      bVar102 = (bool)((byte)(uVar104 >> 1) & 1);
      local_2760._4_4_ = (uint)bVar102 * 0x5d5e0b6b | (uint)!bVar102 * auVar122._4_4_;
      bVar102 = (bool)((byte)(uVar104 >> 2) & 1);
      fStack_2758 = (float)((uint)bVar102 * 0x5d5e0b6b | (uint)!bVar102 * auVar122._8_4_);
      bVar102 = (bool)((byte)(uVar104 >> 3) & 1);
      fStack_2754 = (float)((uint)bVar102 * 0x5d5e0b6b | (uint)!bVar102 * auVar122._12_4_);
      bVar102 = (bool)((byte)(uVar104 >> 4) & 1);
      fStack_2750 = (float)((uint)bVar102 * 0x5d5e0b6b | (uint)!bVar102 * auVar122._16_4_);
      bVar102 = (bool)((byte)(uVar104 >> 5) & 1);
      fStack_274c = (float)((uint)bVar102 * 0x5d5e0b6b | (uint)!bVar102 * auVar122._20_4_);
      bVar102 = (bool)((byte)(uVar104 >> 6) & 1);
      fStack_2748 = (float)((uint)bVar102 * 0x5d5e0b6b | (uint)!bVar102 * auVar122._24_4_);
      bVar102 = SUB81(uVar104 >> 7,0);
      uStack_2744 = (uint)bVar102 * 0x5d5e0b6b | (uint)!bVar102 * auVar122._28_4_;
      bVar102 = (bool)((byte)uVar116 & 1);
      local_2740._0_4_ = (uint)bVar102 * 0x5d5e0b6b | (uint)!bVar102 * auVar119._0_4_;
      bVar102 = (bool)((byte)(uVar116 >> 1) & 1);
      local_2740._4_4_ = (uint)bVar102 * 0x5d5e0b6b | (uint)!bVar102 * auVar119._4_4_;
      bVar102 = (bool)((byte)(uVar116 >> 2) & 1);
      fStack_2738 = (float)((uint)bVar102 * 0x5d5e0b6b | (uint)!bVar102 * auVar119._8_4_);
      bVar102 = (bool)((byte)(uVar116 >> 3) & 1);
      fStack_2734 = (float)((uint)bVar102 * 0x5d5e0b6b | (uint)!bVar102 * auVar119._12_4_);
      bVar102 = (bool)((byte)(uVar116 >> 4) & 1);
      fStack_2730 = (float)((uint)bVar102 * 0x5d5e0b6b | (uint)!bVar102 * auVar119._16_4_);
      bVar102 = (bool)((byte)(uVar116 >> 5) & 1);
      fStack_272c = (float)((uint)bVar102 * 0x5d5e0b6b | (uint)!bVar102 * auVar119._20_4_);
      bVar102 = (bool)((byte)(uVar116 >> 6) & 1);
      fStack_2728 = (float)((uint)bVar102 * 0x5d5e0b6b | (uint)!bVar102 * auVar119._24_4_);
      bVar102 = SUB81(uVar116 >> 7,0);
      uStack_2724 = (uint)bVar102 * 0x5d5e0b6b | (uint)!bVar102 * auVar119._28_4_;
      auVar181 = ZEXT3264(_local_2740);
      uVar105 = vcmpps_avx512vl(local_2780,ZEXT1632(auVar117),1);
      auVar119 = vpbroadcastd_avx512vl(ZEXT416(0x10));
      local_2720 = (uint)((byte)uVar105 & 1) * auVar119._0_4_;
      iStack_271c = (uint)((byte)(uVar105 >> 1) & 1) * auVar119._4_4_;
      iStack_2718 = (uint)((byte)(uVar105 >> 2) & 1) * auVar119._8_4_;
      iStack_2714 = (uint)((byte)(uVar105 >> 3) & 1) * auVar119._12_4_;
      iStack_2710 = (uint)((byte)(uVar105 >> 4) & 1) * auVar119._16_4_;
      iStack_270c = (uint)((byte)(uVar105 >> 5) & 1) * auVar119._20_4_;
      iStack_2708 = (uint)((byte)(uVar105 >> 6) & 1) * auVar119._24_4_;
      iStack_2704 = (uint)(byte)(uVar105 >> 7) * auVar119._28_4_;
      auVar120 = ZEXT1632(auVar117);
      uVar105 = vcmpps_avx512vl(_local_2760,auVar120,5);
      auVar119 = vpbroadcastd_avx512vl(ZEXT416(0x20));
      bVar102 = (bool)((byte)uVar105 & 1);
      bVar9 = (bool)((byte)(uVar105 >> 1) & 1);
      bVar10 = (bool)((byte)(uVar105 >> 2) & 1);
      bVar11 = (bool)((byte)(uVar105 >> 3) & 1);
      bVar12 = (bool)((byte)(uVar105 >> 4) & 1);
      bVar13 = (bool)((byte)(uVar105 >> 5) & 1);
      bVar14 = (bool)((byte)(uVar105 >> 6) & 1);
      bVar15 = SUB81(uVar105 >> 7,0);
      local_2700 = (uint)bVar102 * auVar119._0_4_ | (uint)!bVar102 * 0x30;
      uStack_26fc = (uint)bVar9 * auVar119._4_4_ | (uint)!bVar9 * 0x30;
      uStack_26f8 = (uint)bVar10 * auVar119._8_4_ | (uint)!bVar10 * 0x30;
      uStack_26f4 = (uint)bVar11 * auVar119._12_4_ | (uint)!bVar11 * 0x30;
      uStack_26f0 = (uint)bVar12 * auVar119._16_4_ | (uint)!bVar12 * 0x30;
      uStack_26ec = (uint)bVar13 * auVar119._20_4_ | (uint)!bVar13 * 0x30;
      uStack_26e8 = (uint)bVar14 * auVar119._24_4_ | (uint)!bVar14 * 0x30;
      uStack_26e4 = (uint)bVar15 * auVar119._28_4_ | (uint)!bVar15 * 0x30;
      uVar105 = vcmpps_avx512vl(_local_2740,auVar120,5);
      auVar119 = vpbroadcastd_avx512vl(ZEXT416(0x40));
      bVar102 = (bool)((byte)uVar105 & 1);
      bVar9 = (bool)((byte)(uVar105 >> 1) & 1);
      bVar10 = (bool)((byte)(uVar105 >> 2) & 1);
      bVar11 = (bool)((byte)(uVar105 >> 3) & 1);
      bVar12 = (bool)((byte)(uVar105 >> 4) & 1);
      bVar13 = (bool)((byte)(uVar105 >> 5) & 1);
      bVar14 = (bool)((byte)(uVar105 >> 6) & 1);
      bVar15 = SUB81(uVar105 >> 7,0);
      local_26e0 = (uint)bVar102 * auVar119._0_4_ | (uint)!bVar102 * 0x50;
      uStack_26dc = (uint)bVar9 * auVar119._4_4_ | (uint)!bVar9 * 0x50;
      uStack_26d8 = (uint)bVar10 * auVar119._8_4_ | (uint)!bVar10 * 0x50;
      uStack_26d4 = (uint)bVar11 * auVar119._12_4_ | (uint)!bVar11 * 0x50;
      uStack_26d0 = (uint)bVar12 * auVar119._16_4_ | (uint)!bVar12 * 0x50;
      uStack_26cc = (uint)bVar13 * auVar119._20_4_ | (uint)!bVar13 * 0x50;
      uStack_26c8 = (uint)bVar14 * auVar119._24_4_ | (uint)!bVar14 * 0x50;
      uStack_26c4 = (uint)bVar15 * auVar119._28_4_ | (uint)!bVar15 * 0x50;
      local_1e80 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
      auVar222 = ZEXT3264(local_1e80);
      local_2b64 = (int)uVar115;
      auVar119 = vmaxps_avx512vl(*(undefined1 (*) [32])(ray + 0x60),auVar120);
      local_26c0._0_4_ =
           (uint)(bVar101 & 1) * auVar119._0_4_ | (uint)!(bool)(bVar101 & 1) * local_1e80._0_4_;
      bVar102 = (bool)((byte)(uVar115 >> 1) & 1);
      local_26c0._4_4_ = (uint)bVar102 * auVar119._4_4_ | (uint)!bVar102 * local_1e80._4_4_;
      bVar102 = (bool)((byte)(uVar115 >> 2) & 1);
      local_26c0._8_4_ = (uint)bVar102 * auVar119._8_4_ | (uint)!bVar102 * local_1e80._8_4_;
      bVar102 = (bool)((byte)(uVar115 >> 3) & 1);
      local_26c0._12_4_ = (uint)bVar102 * auVar119._12_4_ | (uint)!bVar102 * local_1e80._12_4_;
      bVar102 = (bool)((byte)(uVar115 >> 4) & 1);
      local_26c0._16_4_ = (uint)bVar102 * auVar119._16_4_ | (uint)!bVar102 * local_1e80._16_4_;
      bVar102 = (bool)((byte)(uVar115 >> 5) & 1);
      local_26c0._20_4_ = (uint)bVar102 * auVar119._20_4_ | (uint)!bVar102 * local_1e80._20_4_;
      bVar102 = (bool)((byte)(uVar115 >> 6) & 1);
      local_26c0._24_4_ = (uint)bVar102 * auVar119._24_4_ | (uint)!bVar102 * local_1e80._24_4_;
      bVar102 = SUB81(uVar115 >> 7,0);
      local_26c0._28_4_ = (uint)bVar102 * auVar119._28_4_ | (uint)!bVar102 * local_1e80._28_4_;
      auVar119 = vmaxps_avx512vl(*(undefined1 (*) [32])(ray + 0x100),auVar120);
      local_26a0._0_4_ =
           (uint)(bVar101 & 1) * auVar119._0_4_ | (uint)!(bool)(bVar101 & 1) * -0x800000;
      bVar102 = (bool)((byte)(uVar115 >> 1) & 1);
      local_26a0._4_4_ = (uint)bVar102 * auVar119._4_4_ | (uint)!bVar102 * -0x800000;
      bVar102 = (bool)((byte)(uVar115 >> 2) & 1);
      local_26a0._8_4_ = (uint)bVar102 * auVar119._8_4_ | (uint)!bVar102 * -0x800000;
      bVar102 = (bool)((byte)(uVar115 >> 3) & 1);
      local_26a0._12_4_ = (uint)bVar102 * auVar119._12_4_ | (uint)!bVar102 * -0x800000;
      bVar102 = (bool)((byte)(uVar115 >> 4) & 1);
      local_26a0._16_4_ = (uint)bVar102 * auVar119._16_4_ | (uint)!bVar102 * -0x800000;
      bVar102 = (bool)((byte)(uVar115 >> 5) & 1);
      local_26a0._20_4_ = (uint)bVar102 * auVar119._20_4_ | (uint)!bVar102 * -0x800000;
      bVar102 = (bool)((byte)(uVar115 >> 6) & 1);
      local_26a0._24_4_ = (uint)bVar102 * auVar119._24_4_ | (uint)!bVar102 * -0x800000;
      bVar102 = SUB81(uVar115 >> 7,0);
      local_26a0._28_4_ = (uint)bVar102 * auVar119._28_4_ | (uint)!bVar102 * -0x800000;
      local_2a58 = This;
      local_2a60 = (BVH *)This->ptr;
      local_2c04 = (uint)(byte)~bVar101;
      if (context->user == (RTCRayQueryContext *)0x0) {
        uVar115 = 5;
      }
      else {
        uVar115 = (ulong)((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) ==
                         RTC_RAY_QUERY_FLAG_INCOHERENT) * 3 + 2;
      }
      local_2b70 = ray + 0x100;
      puVar112 = local_2600;
      local_2610 = 0xfffffffffffffff8;
      pauVar108 = (undefined1 (*) [32])local_1e40;
      local_1e60 = local_26c0;
      local_2b10 = (undefined1 (*) [32])&local_2960;
      auVar119 = vbroadcastss_avx512vl(ZEXT416(0x3f7ffffa));
      auVar223 = ZEXT3264(auVar119);
      auVar119 = vbroadcastss_avx512vl(ZEXT416(0x3f800003));
      auVar224 = ZEXT3264(auVar119);
      auVar119 = vbroadcastss_avx512vl(ZEXT416(0x34000000));
      auVar219 = ZEXT3264(auVar119);
      auVar119 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
      auVar218 = ZEXT3264(auVar119);
LAB_01d0b092:
      do {
        do {
          root.ptr = puVar112[-1];
          if (root.ptr == 0xfffffffffffffff8) goto LAB_01d0ca8c;
          puVar112 = puVar112 + -1;
          local_2b60 = pauVar108[-1];
          auVar217 = ZEXT3264(local_2b60);
          pauVar108 = pauVar108 + -1;
          uVar105 = vcmpps_avx512vl(local_2b60,local_26a0,1);
        } while ((char)uVar105 == '\0');
        uVar104 = CONCAT44(0,POPCOUNT((int)uVar105));
        if (uVar115 < uVar104) {
LAB_01d0b0d3:
          do {
            lVar106 = -0x10;
            uVar113 = (uint)root.ptr;
            if ((root.ptr & 8) != 0) {
              if (root.ptr == 0xfffffffffffffff8) goto LAB_01d0ca8c;
              uVar18 = vcmpps_avx512vl(auVar217._0_32_,local_26a0,9);
              if ((char)uVar18 == '\0') goto LAB_01d0b092;
              local_2a50 = (ulong)(uVar113 & 0xf) - 8;
              bVar101 = ~(byte)local_2c04;
              lVar106 = 0;
              goto LAB_01d0b334;
            }
            uVar105 = root.ptr & 0xfffffffffffffff0;
            root.ptr = 8;
            auVar119 = auVar222._0_32_;
            for (; (lVar106 != 0 &&
                   (uVar104 = *(ulong *)(uVar105 + 0x20 + lVar106 * 2), uVar104 != 8));
                lVar106 = lVar106 + 4) {
              uVar1 = *(undefined4 *)(uVar105 + 0x90 + lVar106);
              auVar169._4_4_ = uVar1;
              auVar169._0_4_ = uVar1;
              auVar169._8_4_ = uVar1;
              auVar169._12_4_ = uVar1;
              auVar169._16_4_ = uVar1;
              auVar169._20_4_ = uVar1;
              auVar169._24_4_ = uVar1;
              auVar169._28_4_ = uVar1;
              auVar120 = *(undefined1 (*) [32])(ray + 0xe0);
              uVar1 = *(undefined4 *)(uVar105 + 0x30 + lVar106);
              auVar21._4_4_ = uVar1;
              auVar21._0_4_ = uVar1;
              auVar21._8_4_ = uVar1;
              auVar21._12_4_ = uVar1;
              auVar21._16_4_ = uVar1;
              auVar21._20_4_ = uVar1;
              auVar21._24_4_ = uVar1;
              auVar21._28_4_ = uVar1;
              auVar121 = vfmadd213ps_avx512vl(auVar169,auVar120,auVar21);
              uVar1 = *(undefined4 *)(uVar105 + 0xb0 + lVar106);
              auVar179._4_4_ = uVar1;
              auVar179._0_4_ = uVar1;
              auVar179._8_4_ = uVar1;
              auVar179._12_4_ = uVar1;
              auVar179._16_4_ = uVar1;
              auVar179._20_4_ = uVar1;
              auVar179._24_4_ = uVar1;
              auVar179._28_4_ = uVar1;
              uVar1 = *(undefined4 *)(uVar105 + 0x50 + lVar106);
              auVar22._4_4_ = uVar1;
              auVar22._0_4_ = uVar1;
              auVar22._8_4_ = uVar1;
              auVar22._12_4_ = uVar1;
              auVar22._16_4_ = uVar1;
              auVar22._20_4_ = uVar1;
              auVar22._24_4_ = uVar1;
              auVar22._28_4_ = uVar1;
              auVar122 = vfmadd213ps_avx512vl(auVar179,auVar120,auVar22);
              uVar1 = *(undefined4 *)(uVar105 + 0xd0 + lVar106);
              auVar188._4_4_ = uVar1;
              auVar188._0_4_ = uVar1;
              auVar188._8_4_ = uVar1;
              auVar188._12_4_ = uVar1;
              auVar188._16_4_ = uVar1;
              auVar188._20_4_ = uVar1;
              auVar188._24_4_ = uVar1;
              auVar188._28_4_ = uVar1;
              uVar1 = *(undefined4 *)(uVar105 + 0x70 + lVar106);
              auVar23._4_4_ = uVar1;
              auVar23._0_4_ = uVar1;
              auVar23._8_4_ = uVar1;
              auVar23._12_4_ = uVar1;
              auVar23._16_4_ = uVar1;
              auVar23._20_4_ = uVar1;
              auVar23._24_4_ = uVar1;
              auVar23._28_4_ = uVar1;
              auVar123 = vfmadd213ps_avx512vl(auVar188,auVar120,auVar23);
              uVar1 = *(undefined4 *)(uVar105 + 0xa0 + lVar106);
              auVar189._4_4_ = uVar1;
              auVar189._0_4_ = uVar1;
              auVar189._8_4_ = uVar1;
              auVar189._12_4_ = uVar1;
              auVar189._16_4_ = uVar1;
              auVar189._20_4_ = uVar1;
              auVar189._24_4_ = uVar1;
              auVar189._28_4_ = uVar1;
              uVar1 = *(undefined4 *)(uVar105 + 0x40 + lVar106);
              auVar24._4_4_ = uVar1;
              auVar24._0_4_ = uVar1;
              auVar24._8_4_ = uVar1;
              auVar24._12_4_ = uVar1;
              auVar24._16_4_ = uVar1;
              auVar24._20_4_ = uVar1;
              auVar24._24_4_ = uVar1;
              auVar24._28_4_ = uVar1;
              auVar124 = vfmadd213ps_avx512vl(auVar189,auVar120,auVar24);
              uVar1 = *(undefined4 *)(uVar105 + 0xc0 + lVar106);
              auVar194._4_4_ = uVar1;
              auVar194._0_4_ = uVar1;
              auVar194._8_4_ = uVar1;
              auVar194._12_4_ = uVar1;
              auVar194._16_4_ = uVar1;
              auVar194._20_4_ = uVar1;
              auVar194._24_4_ = uVar1;
              auVar194._28_4_ = uVar1;
              uVar1 = *(undefined4 *)(uVar105 + 0x60 + lVar106);
              auVar25._4_4_ = uVar1;
              auVar25._0_4_ = uVar1;
              auVar25._8_4_ = uVar1;
              auVar25._12_4_ = uVar1;
              auVar25._16_4_ = uVar1;
              auVar25._20_4_ = uVar1;
              auVar25._24_4_ = uVar1;
              auVar25._28_4_ = uVar1;
              auVar125 = vfmadd213ps_avx512vl(auVar194,auVar120,auVar25);
              uVar1 = *(undefined4 *)(uVar105 + 0xe0 + lVar106);
              auVar202._4_4_ = uVar1;
              auVar202._0_4_ = uVar1;
              auVar202._8_4_ = uVar1;
              auVar202._12_4_ = uVar1;
              auVar202._16_4_ = uVar1;
              auVar202._20_4_ = uVar1;
              auVar202._24_4_ = uVar1;
              auVar202._28_4_ = uVar1;
              uVar1 = *(undefined4 *)(uVar105 + 0x80 + lVar106);
              auVar26._4_4_ = uVar1;
              auVar26._0_4_ = uVar1;
              auVar26._8_4_ = uVar1;
              auVar26._12_4_ = uVar1;
              auVar26._16_4_ = uVar1;
              auVar26._20_4_ = uVar1;
              auVar26._24_4_ = uVar1;
              auVar26._28_4_ = uVar1;
              auVar126 = vfmadd213ps_avx512vl(auVar202,auVar120,auVar26);
              auVar56._8_8_ = local_2840._8_8_;
              auVar56._0_8_ = local_2840._0_8_;
              auVar56._16_8_ = local_2840._16_8_;
              auVar56._24_8_ = local_2840._24_8_;
              auVar57._8_8_ = local_2840._40_8_;
              auVar57._0_8_ = local_2840._32_8_;
              auVar57._16_8_ = local_2840._48_8_;
              auVar57._24_8_ = local_2840._56_8_;
              in_ZMM10 = ZEXT3264(auVar57);
              auVar58._8_8_ = local_2840._72_8_;
              auVar58._0_8_ = local_2840._64_8_;
              auVar58._16_8_ = local_2840._80_8_;
              auVar58._24_8_ = local_2840._88_8_;
              in_ZMM11 = ZEXT3264(auVar58);
              in_ZMM12 = ZEXT3264(local_2780);
              auVar121 = vsubps_avx(auVar121,auVar56);
              auVar181._0_4_ = local_2780._0_4_ * auVar121._0_4_;
              auVar181._4_4_ = local_2780._4_4_ * auVar121._4_4_;
              auVar181._8_4_ = local_2780._8_4_ * auVar121._8_4_;
              auVar181._12_4_ = local_2780._12_4_ * auVar121._12_4_;
              auVar181._16_4_ = local_2780._16_4_ * auVar121._16_4_;
              auVar181._20_4_ = local_2780._20_4_ * auVar121._20_4_;
              auVar181._28_36_ = in_ZMM13._28_36_;
              auVar181._24_4_ = local_2780._24_4_ * auVar121._24_4_;
              auVar130 = auVar181._0_32_;
              in_ZMM13 = ZEXT3264(auVar130);
              auVar121 = vsubps_avx(auVar122,auVar57);
              auVar215._0_4_ = auVar121._0_4_ * (float)local_2760._0_4_;
              auVar215._4_4_ = auVar121._4_4_ * (float)local_2760._4_4_;
              auVar215._8_4_ = auVar121._8_4_ * fStack_2758;
              auVar215._12_4_ = auVar121._12_4_ * fStack_2754;
              auVar215._16_4_ = auVar121._16_4_ * fStack_2750;
              auVar215._20_4_ = auVar121._20_4_ * fStack_274c;
              auVar215._28_36_ = in_ZMM14._28_36_;
              auVar215._24_4_ = auVar121._24_4_ * fStack_2748;
              auVar128 = auVar215._0_32_;
              in_ZMM14 = ZEXT3264(auVar128);
              auVar121 = vsubps_avx(auVar123,auVar58);
              auVar216._0_4_ = auVar121._0_4_ * (float)local_2740._0_4_;
              auVar216._4_4_ = auVar121._4_4_ * (float)local_2740._4_4_;
              auVar216._8_4_ = auVar121._8_4_ * fStack_2738;
              auVar216._12_4_ = auVar121._12_4_ * fStack_2734;
              auVar216._16_4_ = auVar121._16_4_ * fStack_2730;
              auVar216._20_4_ = auVar121._20_4_ * fStack_272c;
              auVar216._28_36_ = in_ZMM15._28_36_;
              auVar216._24_4_ = auVar121._24_4_ * fStack_2728;
              auVar129 = auVar216._0_32_;
              in_ZMM15 = ZEXT3264(auVar129);
              auVar121 = vsubps_avx(auVar124,auVar56);
              auVar41._4_4_ = local_2780._4_4_ * auVar121._4_4_;
              auVar41._0_4_ = local_2780._0_4_ * auVar121._0_4_;
              auVar41._8_4_ = local_2780._8_4_ * auVar121._8_4_;
              auVar41._12_4_ = local_2780._12_4_ * auVar121._12_4_;
              auVar41._16_4_ = local_2780._16_4_ * auVar121._16_4_;
              auVar41._20_4_ = local_2780._20_4_ * auVar121._20_4_;
              auVar41._24_4_ = local_2780._24_4_ * auVar121._24_4_;
              auVar41._28_4_ = auVar124._28_4_;
              auVar121 = vsubps_avx(auVar125,auVar57);
              auVar42._4_4_ = auVar121._4_4_ * (float)local_2760._4_4_;
              auVar42._0_4_ = auVar121._0_4_ * (float)local_2760._0_4_;
              auVar42._8_4_ = auVar121._8_4_ * fStack_2758;
              auVar42._12_4_ = auVar121._12_4_ * fStack_2754;
              auVar42._16_4_ = auVar121._16_4_ * fStack_2750;
              auVar42._20_4_ = auVar121._20_4_ * fStack_274c;
              auVar42._24_4_ = auVar121._24_4_ * fStack_2748;
              auVar42._28_4_ = uStack_2744;
              auVar121 = vsubps_avx(auVar126,auVar58);
              auVar43._4_4_ = auVar121._4_4_ * (float)local_2740._4_4_;
              auVar43._0_4_ = auVar121._0_4_ * (float)local_2740._0_4_;
              auVar43._8_4_ = auVar121._8_4_ * fStack_2738;
              auVar43._12_4_ = auVar121._12_4_ * fStack_2734;
              auVar43._16_4_ = auVar121._16_4_ * fStack_2730;
              auVar43._20_4_ = auVar121._20_4_ * fStack_272c;
              auVar43._24_4_ = auVar121._24_4_ * fStack_2728;
              auVar43._28_4_ = uStack_2724;
              auVar121 = vpminsd_avx2(auVar130,auVar41);
              auVar122 = vpminsd_avx2(auVar128,auVar42);
              auVar121 = vpmaxsd_avx2(auVar121,auVar122);
              auVar122 = vpminsd_avx2(auVar129,auVar43);
              in_ZMM7 = ZEXT3264(auVar122);
              auVar121 = vpmaxsd_avx2(auVar121,auVar122);
              auVar123 = vmulps_avx512vl(auVar121,auVar223._0_32_);
              auVar121 = vpmaxsd_avx2(auVar130,auVar41);
              auVar122 = vpmaxsd_avx2(auVar128,auVar42);
              auVar122 = vpminsd_avx2(auVar121,auVar122);
              auVar121 = vpmaxsd_avx2(auVar129,auVar43);
              auVar121 = vpminsd_avx2(auVar122,auVar121);
              auVar122 = vmulps_avx512vl(auVar121,auVar224._0_32_);
              auVar121 = vpmaxsd_avx2(auVar123,local_26c0);
              auVar181 = ZEXT3264(auVar121);
              auVar122 = vpminsd_avx2(auVar122,local_26a0);
              uVar116 = vcmpps_avx512vl(auVar121,auVar122,2);
              if ((uVar113 & 7) == 6) {
                uVar1 = *(undefined4 *)(uVar105 + 0xf0 + lVar106);
                auVar27._4_4_ = uVar1;
                auVar27._0_4_ = uVar1;
                auVar27._8_4_ = uVar1;
                auVar27._12_4_ = uVar1;
                auVar27._16_4_ = uVar1;
                auVar27._20_4_ = uVar1;
                auVar27._24_4_ = uVar1;
                auVar27._28_4_ = uVar1;
                uVar110 = vcmpps_avx512vl(auVar120,auVar27,0xd);
                uVar1 = *(undefined4 *)(uVar105 + 0x100 + lVar106);
                auVar28._4_4_ = uVar1;
                auVar28._0_4_ = uVar1;
                auVar28._8_4_ = uVar1;
                auVar28._12_4_ = uVar1;
                auVar28._16_4_ = uVar1;
                auVar28._20_4_ = uVar1;
                auVar28._24_4_ = uVar1;
                auVar28._28_4_ = uVar1;
                uVar17 = vcmpps_avx512vl(auVar120,auVar28,1);
                uVar116 = uVar116 & uVar110 & uVar17;
              }
              uVar110 = vcmpps_avx512vl(local_26a0,auVar217._0_32_,6);
              uVar116 = uVar116 & uVar110;
              uVar110 = root.ptr;
              auVar127 = auVar119;
              if ((byte)uVar116 != 0) {
                auVar121 = vblendmps_avx512vl(auVar222._0_32_,auVar123);
                bVar102 = (bool)((byte)uVar116 & 1);
                auVar127._0_4_ = (uint)bVar102 * auVar121._0_4_ | (uint)!bVar102 * auVar120._0_4_;
                bVar102 = (bool)((byte)(uVar116 >> 1) & 1);
                auVar127._4_4_ = (uint)bVar102 * auVar121._4_4_ | (uint)!bVar102 * auVar120._4_4_;
                bVar102 = (bool)((byte)(uVar116 >> 2) & 1);
                auVar127._8_4_ = (uint)bVar102 * auVar121._8_4_ | (uint)!bVar102 * auVar120._8_4_;
                bVar102 = (bool)((byte)(uVar116 >> 3) & 1);
                auVar127._12_4_ = (uint)bVar102 * auVar121._12_4_ | (uint)!bVar102 * auVar120._12_4_
                ;
                bVar102 = (bool)((byte)(uVar116 >> 4) & 1);
                auVar127._16_4_ = (uint)bVar102 * auVar121._16_4_ | (uint)!bVar102 * auVar120._16_4_
                ;
                bVar102 = (bool)((byte)(uVar116 >> 5) & 1);
                auVar127._20_4_ = (uint)bVar102 * auVar121._20_4_ | (uint)!bVar102 * auVar120._20_4_
                ;
                bVar102 = (bool)((byte)(uVar116 >> 6) & 1);
                auVar127._24_4_ = (uint)bVar102 * auVar121._24_4_ | (uint)!bVar102 * auVar120._24_4_
                ;
                bVar102 = SUB81(uVar116 >> 7,0);
                auVar127._28_4_ = (uint)bVar102 * auVar121._28_4_ | (uint)!bVar102 * auVar120._28_4_
                ;
                uVar110 = uVar104;
                if (root.ptr != 8) {
                  *puVar112 = root.ptr;
                  puVar112 = puVar112 + 1;
                  *pauVar108 = auVar119;
                  pauVar108 = pauVar108 + 1;
                }
              }
              auVar119 = auVar127;
              root.ptr = uVar110;
            }
            if (root.ptr == 8) goto LAB_01d0b2e3;
            uVar18 = vcmpps_avx512vl(auVar119,local_26a0,9);
            auVar217 = ZEXT3264(auVar119);
          } while ((byte)uVar115 < (byte)POPCOUNT((int)uVar18));
          *puVar112 = root.ptr;
          puVar112 = puVar112 + 1;
          *pauVar108 = auVar119;
          pauVar108 = pauVar108 + 1;
LAB_01d0b2e3:
          iVar103 = 4;
        }
        else {
          local_2b40._0_8_ = uVar104;
          while (bVar101 = (byte)local_2c04, uVar105 != 0) {
            local_2bd0 = 0;
            for (uVar104 = uVar105; (uVar104 & 1) == 0; uVar104 = uVar104 >> 1 | 0x8000000000000000)
            {
              local_2bd0 = local_2bd0 + 1;
            }
            uVar105 = uVar105 - 1 & uVar105;
            auVar181 = ZEXT1664(auVar181._0_16_);
            in_ZMM7 = ZEXT1664(in_ZMM7._0_16_);
            in_ZMM10 = ZEXT1664(in_ZMM10._0_16_);
            in_ZMM11 = ZEXT1664(in_ZMM11._0_16_);
            in_ZMM12 = ZEXT1664(in_ZMM12._0_16_);
            in_ZMM13 = ZEXT1664(in_ZMM13._0_16_);
            in_ZMM14 = ZEXT1664(in_ZMM14._0_16_);
            in_ZMM15 = ZEXT1664(in_ZMM15._0_16_);
            bVar102 = occluded1(local_2a58,local_2a60,root,local_2bd0,&local_2bd1,ray,
                                (TravRayK<8,_true> *)&local_2840.field_0,context);
            bVar114 = (byte)(1 << ((uint)local_2bd0 & 0x1f));
            if (!bVar102) {
              bVar114 = 0;
            }
            local_2c04 = (uint)(bVar101 | bVar114);
          }
          iVar103 = 3;
          auVar119 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
          auVar220 = ZEXT3264(auVar119);
          auVar119 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
          auVar221 = ZEXT3264(auVar119);
          auVar119 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
          auVar222 = ZEXT3264(auVar119);
          auVar119 = vbroadcastss_avx512vl(ZEXT416(0x3f7ffffa));
          auVar223 = ZEXT3264(auVar119);
          auVar119 = vbroadcastss_avx512vl(ZEXT416(0x3f800003));
          auVar224 = ZEXT3264(auVar119);
          auVar119 = vbroadcastss_avx512vl(ZEXT416(0x34000000));
          auVar219 = ZEXT3264(auVar119);
          auVar119 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
          auVar218 = ZEXT3264(auVar119);
          auVar217 = ZEXT3264(local_2b60);
          if (bVar101 != 0xff) {
            auVar119 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
            local_26a0._0_4_ =
                 (uint)(bVar101 & 1) * auVar119._0_4_ |
                 (uint)!(bool)(bVar101 & 1) * local_26a0._0_4_;
            bVar102 = (bool)((byte)(local_2c04 >> 1) & 1);
            local_26a0._4_4_ = (uint)bVar102 * auVar119._4_4_ | (uint)!bVar102 * local_26a0._4_4_;
            bVar102 = (bool)((byte)(local_2c04 >> 2) & 1);
            local_26a0._8_4_ = (uint)bVar102 * auVar119._8_4_ | (uint)!bVar102 * local_26a0._8_4_;
            bVar102 = (bool)((byte)(local_2c04 >> 3) & 1);
            local_26a0._12_4_ = (uint)bVar102 * auVar119._12_4_ | (uint)!bVar102 * local_26a0._12_4_
            ;
            bVar102 = (bool)((byte)(local_2c04 >> 4) & 1);
            local_26a0._16_4_ = (uint)bVar102 * auVar119._16_4_ | (uint)!bVar102 * local_26a0._16_4_
            ;
            bVar102 = (bool)((byte)(local_2c04 >> 5) & 1);
            local_26a0._20_4_ = (uint)bVar102 * auVar119._20_4_ | (uint)!bVar102 * local_26a0._20_4_
            ;
            bVar102 = (bool)((byte)(local_2c04 >> 6) & 1);
            local_26a0._24_4_ = (uint)bVar102 * auVar119._24_4_ | (uint)!bVar102 * local_26a0._24_4_
            ;
            local_26a0._28_4_ =
                 (local_2c04 >> 7) * auVar119._28_4_ |
                 (uint)!SUB41(local_2c04 >> 7,0) * local_26a0._28_4_;
            iVar103 = 2;
          }
          if ((uint)uVar115 < (uint)local_2b40._0_4_) goto LAB_01d0b0d3;
        }
      } while (iVar103 != 3);
LAB_01d0ca8c:
      local_2b64._0_1_ = (byte)local_2c04 & (byte)local_2b64;
      bVar102 = (bool)((byte)local_2b64 >> 1 & 1);
      bVar9 = (bool)((byte)local_2b64 >> 2 & 1);
      bVar10 = (bool)((byte)local_2b64 >> 3 & 1);
      bVar11 = (bool)((byte)local_2b64 >> 4 & 1);
      bVar12 = (bool)((byte)local_2b64 >> 5 & 1);
      bVar13 = (bool)((byte)local_2b64 >> 6 & 1);
      *(uint *)local_2b70 =
           (uint)((byte)local_2b64 & 1) * -0x800000 |
           (uint)!(bool)((byte)local_2b64 & 1) * *(int *)local_2b70;
      *(uint *)(local_2b70 + 4) =
           (uint)bVar102 * -0x800000 | (uint)!bVar102 * *(int *)(local_2b70 + 4);
      *(uint *)(local_2b70 + 8) = (uint)bVar9 * -0x800000 | (uint)!bVar9 * *(int *)(local_2b70 + 8);
      *(uint *)(local_2b70 + 0xc) =
           (uint)bVar10 * -0x800000 | (uint)!bVar10 * *(int *)(local_2b70 + 0xc);
      *(uint *)(local_2b70 + 0x10) =
           (uint)bVar11 * -0x800000 | (uint)!bVar11 * *(int *)(local_2b70 + 0x10);
      *(uint *)(local_2b70 + 0x14) =
           (uint)bVar12 * -0x800000 | (uint)!bVar12 * *(int *)(local_2b70 + 0x14);
      *(uint *)(local_2b70 + 0x18) =
           (uint)bVar13 * -0x800000 | (uint)!bVar13 * *(int *)(local_2b70 + 0x18);
      *(uint *)(local_2b70 + 0x1c) =
           (uint)((byte)local_2b64 >> 7) * -0x800000 |
           (uint)!(bool)((byte)local_2b64 >> 7) * *(int *)(local_2b70 + 0x1c);
    }
  }
  return;
LAB_01d0b334:
  do {
    local_2bd8 = (uint)bVar101;
    if (lVar106 == local_2a50) goto LAB_01d0c927;
    lVar109 = lVar106 * 0x60 + (root.ptr & 0xfffffffffffffff0);
    local_2bc8 = 0;
    for (uVar105 = (ulong)local_2bd8; (uVar105 & 1) == 0;
        uVar105 = uVar105 >> 1 | 0x8000000000000000) {
      local_2bc8 = local_2bc8 + 1;
    }
    local_2b78 = (ulong)local_2bd8;
    uVar105 = (ulong)local_2bd8;
    lVar111 = 0;
    local_2b08 = lVar106;
    do {
      if ((lVar111 == 4) || (iVar103 = *(int *)(lVar109 + 0x50 + lVar111 * 4), iVar103 == -1))
      goto LAB_01d0c90c;
      local_2920._0_4_ = iVar103;
      local_2bd0 = CONCAT44(local_2bd0._4_4_,(int)uVar105);
      local_2a48 = (ulong)*(uint *)(lVar109 + 0x40 + lVar111 * 4);
      pGVar6 = (context->scene->geometries).items[local_2a48].ptr;
      BVar2 = pGVar6->time_range;
      auVar157._8_8_ = 0;
      auVar157._0_4_ = BVar2.lower;
      auVar157._4_4_ = BVar2.upper;
      fVar204 = pGVar6->fnumTimeSegments;
      auVar166._4_4_ = fVar204;
      auVar166._0_4_ = fVar204;
      auVar166._8_4_ = fVar204;
      auVar166._12_4_ = fVar204;
      fVar192 = BVar2.lower;
      auVar119._4_4_ = fVar192;
      auVar119._0_4_ = fVar192;
      auVar119._8_4_ = fVar192;
      auVar119._12_4_ = fVar192;
      auVar119._16_4_ = fVar192;
      auVar119._20_4_ = fVar192;
      auVar119._24_4_ = fVar192;
      auVar119._28_4_ = fVar192;
      auVar119 = vsubps_avx(*(undefined1 (*) [32])(ray + 0xe0),auVar119);
      auVar117 = vmovshdup_avx(auVar157);
      auVar117 = vsubps_avx(auVar117,auVar157);
      auVar120._0_4_ = auVar117._0_4_;
      auVar120._4_4_ = auVar120._0_4_;
      auVar120._8_4_ = auVar120._0_4_;
      auVar120._12_4_ = auVar120._0_4_;
      auVar120._16_4_ = auVar120._0_4_;
      auVar120._20_4_ = auVar120._0_4_;
      auVar120._24_4_ = auVar120._0_4_;
      auVar120._28_4_ = auVar120._0_4_;
      auVar119 = vdivps_avx(auVar119,auVar120);
      auVar121._4_4_ = fVar204 * auVar119._4_4_;
      auVar121._0_4_ = fVar204 * auVar119._0_4_;
      auVar121._8_4_ = fVar204 * auVar119._8_4_;
      auVar121._12_4_ = fVar204 * auVar119._12_4_;
      auVar121._16_4_ = fVar204 * auVar119._16_4_;
      auVar121._20_4_ = fVar204 * auVar119._20_4_;
      auVar121._24_4_ = fVar204 * auVar119._24_4_;
      auVar121._28_4_ = auVar119._28_4_;
      auVar119 = vroundps_avx(auVar121,1);
      auVar117 = vaddss_avx512f(auVar166,SUB6416(ZEXT464(0xbf800000),0));
      auVar122._0_4_ = auVar117._0_4_;
      auVar122._4_4_ = auVar122._0_4_;
      auVar122._8_4_ = auVar122._0_4_;
      auVar122._12_4_ = auVar122._0_4_;
      auVar122._16_4_ = auVar122._0_4_;
      auVar122._20_4_ = auVar122._0_4_;
      auVar122._24_4_ = auVar122._0_4_;
      auVar122._28_4_ = auVar122._0_4_;
      auVar119 = vminps_avx(auVar119,auVar122);
      auVar120 = vmaxps_avx(auVar119,_DAT_01f7b000);
      auVar119 = vcvtps2dq_avx(auVar120);
      local_2bc0.valid = (int *)auVar119._0_8_;
      local_2bc0.geometryUserPtr = (void *)auVar119._8_8_;
      local_2bc0.context = (RTCRayQueryContext *)auVar119._16_8_;
      local_2bc0.ray = (RTCRayN *)auVar119._24_8_;
      auVar120 = vsubps_avx(auVar121,auVar120);
      auVar121 = vpbroadcastd_avx512vl();
      auVar217 = ZEXT3264(auVar121);
      uVar18 = vpcmpeqd_avx512vl(auVar121,auVar119);
      auVar119 = auVar221._0_32_;
      uVar116 = local_2b78;
      uVar104 = local_2bc8;
      if ((byte)((byte)uVar18 | ~bVar101) == 0xff) {
        lVar107 = (long)*(int *)((long)&local_2bc0.valid + local_2bc8 * 4) * 0x38;
        lVar106 = *(long *)(*(long *)&pGVar6[2].numPrimitives + lVar107);
        lVar107 = *(long *)(*(long *)&pGVar6[2].numPrimitives + 0x38 + lVar107);
        uVar104 = (ulong)*(uint *)(lVar109 + lVar111 * 4);
        uVar116 = (ulong)*(uint *)(lVar109 + 0x10 + lVar111 * 4);
        auVar121 = vsubps_avx512vl(auVar119,auVar120);
        uVar1 = *(undefined4 *)(lVar107 + uVar104 * 4);
        auVar131._4_4_ = uVar1;
        auVar131._0_4_ = uVar1;
        auVar131._8_4_ = uVar1;
        auVar131._12_4_ = uVar1;
        auVar131._16_4_ = uVar1;
        auVar131._20_4_ = uVar1;
        auVar131._24_4_ = uVar1;
        auVar131._28_4_ = uVar1;
        auVar122 = vmulps_avx512vl(auVar120,auVar131);
        uVar1 = *(undefined4 *)(lVar107 + 4 + uVar104 * 4);
        auVar132._4_4_ = uVar1;
        auVar132._0_4_ = uVar1;
        auVar132._8_4_ = uVar1;
        auVar132._12_4_ = uVar1;
        auVar132._16_4_ = uVar1;
        auVar132._20_4_ = uVar1;
        auVar132._24_4_ = uVar1;
        auVar132._28_4_ = uVar1;
        auVar123 = vmulps_avx512vl(auVar120,auVar132);
        uVar1 = *(undefined4 *)(lVar107 + 8 + uVar104 * 4);
        auVar133._4_4_ = uVar1;
        auVar133._0_4_ = uVar1;
        auVar133._8_4_ = uVar1;
        auVar133._12_4_ = uVar1;
        auVar133._16_4_ = uVar1;
        auVar133._20_4_ = uVar1;
        auVar133._24_4_ = uVar1;
        auVar133._28_4_ = uVar1;
        auVar126 = vmulps_avx512vl(auVar120,auVar133);
        uVar1 = *(undefined4 *)(lVar106 + uVar104 * 4);
        auVar134._4_4_ = uVar1;
        auVar134._0_4_ = uVar1;
        auVar134._8_4_ = uVar1;
        auVar134._12_4_ = uVar1;
        auVar134._16_4_ = uVar1;
        auVar134._20_4_ = uVar1;
        auVar134._24_4_ = uVar1;
        auVar134._28_4_ = uVar1;
        auVar125 = vfmadd231ps_avx512vl(auVar122,auVar121,auVar134);
        uVar1 = *(undefined4 *)(lVar106 + 4 + uVar104 * 4);
        auVar135._4_4_ = uVar1;
        auVar135._0_4_ = uVar1;
        auVar135._8_4_ = uVar1;
        auVar135._12_4_ = uVar1;
        auVar135._16_4_ = uVar1;
        auVar135._20_4_ = uVar1;
        auVar135._24_4_ = uVar1;
        auVar135._28_4_ = uVar1;
        auVar124 = vfmadd231ps_avx512vl(auVar123,auVar121,auVar135);
        uVar1 = *(undefined4 *)(lVar106 + 8 + uVar104 * 4);
        auVar136._4_4_ = uVar1;
        auVar136._0_4_ = uVar1;
        auVar136._8_4_ = uVar1;
        auVar136._12_4_ = uVar1;
        auVar136._16_4_ = uVar1;
        auVar136._20_4_ = uVar1;
        auVar136._24_4_ = uVar1;
        auVar136._28_4_ = uVar1;
        auVar128 = vfmadd231ps_avx512vl(auVar126,auVar121,auVar136);
        uVar1 = *(undefined4 *)(lVar107 + uVar116 * 4);
        auVar137._4_4_ = uVar1;
        auVar137._0_4_ = uVar1;
        auVar137._8_4_ = uVar1;
        auVar137._12_4_ = uVar1;
        auVar137._16_4_ = uVar1;
        auVar137._20_4_ = uVar1;
        auVar137._24_4_ = uVar1;
        auVar137._28_4_ = uVar1;
        auVar122 = vmulps_avx512vl(auVar120,auVar137);
        uVar1 = *(undefined4 *)(lVar107 + 4 + uVar116 * 4);
        auVar138._4_4_ = uVar1;
        auVar138._0_4_ = uVar1;
        auVar138._8_4_ = uVar1;
        auVar138._12_4_ = uVar1;
        auVar138._16_4_ = uVar1;
        auVar138._20_4_ = uVar1;
        auVar138._24_4_ = uVar1;
        auVar138._28_4_ = uVar1;
        auVar123 = vmulps_avx512vl(auVar120,auVar138);
        uVar1 = *(undefined4 *)(lVar107 + 8 + uVar116 * 4);
        auVar139._4_4_ = uVar1;
        auVar139._0_4_ = uVar1;
        auVar139._8_4_ = uVar1;
        auVar139._12_4_ = uVar1;
        auVar139._16_4_ = uVar1;
        auVar139._20_4_ = uVar1;
        auVar139._24_4_ = uVar1;
        auVar139._28_4_ = uVar1;
        auVar129 = vmulps_avx512vl(auVar120,auVar139);
        uVar1 = *(undefined4 *)(lVar106 + uVar116 * 4);
        auVar140._4_4_ = uVar1;
        auVar140._0_4_ = uVar1;
        auVar140._8_4_ = uVar1;
        auVar140._12_4_ = uVar1;
        auVar140._16_4_ = uVar1;
        auVar140._20_4_ = uVar1;
        auVar140._24_4_ = uVar1;
        auVar140._28_4_ = uVar1;
        auVar130 = vfmadd231ps_avx512vl(auVar122,auVar121,auVar140);
        uVar1 = *(undefined4 *)(lVar106 + 4 + uVar116 * 4);
        auVar141._4_4_ = uVar1;
        auVar141._0_4_ = uVar1;
        auVar141._8_4_ = uVar1;
        auVar141._12_4_ = uVar1;
        auVar141._16_4_ = uVar1;
        auVar141._20_4_ = uVar1;
        auVar141._24_4_ = uVar1;
        auVar141._28_4_ = uVar1;
        auVar126 = vfmadd231ps_avx512vl(auVar123,auVar121,auVar141);
        uVar1 = *(undefined4 *)(lVar106 + 8 + uVar116 * 4);
        auVar142._4_4_ = uVar1;
        auVar142._0_4_ = uVar1;
        auVar142._8_4_ = uVar1;
        auVar142._12_4_ = uVar1;
        auVar142._16_4_ = uVar1;
        auVar142._20_4_ = uVar1;
        auVar142._24_4_ = uVar1;
        auVar142._28_4_ = uVar1;
        local_2680 = vfmadd231ps_avx512vl(auVar129,auVar121,auVar142);
        uVar104 = (ulong)*(uint *)(lVar109 + 0x20 + lVar111 * 4);
        uVar1 = *(undefined4 *)(lVar107 + uVar104 * 4);
        auVar147._4_4_ = uVar1;
        auVar147._0_4_ = uVar1;
        auVar147._8_4_ = uVar1;
        auVar147._12_4_ = uVar1;
        auVar147._16_4_ = uVar1;
        auVar147._20_4_ = uVar1;
        auVar147._24_4_ = uVar1;
        auVar147._28_4_ = uVar1;
        auVar122 = vmulps_avx512vl(auVar120,auVar147);
        uVar1 = *(undefined4 *)(lVar107 + 4 + uVar104 * 4);
        auVar148._4_4_ = uVar1;
        auVar148._0_4_ = uVar1;
        auVar148._8_4_ = uVar1;
        auVar148._12_4_ = uVar1;
        auVar148._16_4_ = uVar1;
        auVar148._20_4_ = uVar1;
        auVar148._24_4_ = uVar1;
        auVar148._28_4_ = uVar1;
        auVar123 = vmulps_avx512vl(auVar120,auVar148);
        uVar1 = *(undefined4 *)(lVar107 + 8 + uVar104 * 4);
        auVar29._4_4_ = uVar1;
        auVar29._0_4_ = uVar1;
        auVar29._8_4_ = uVar1;
        auVar29._12_4_ = uVar1;
        auVar29._16_4_ = uVar1;
        auVar29._20_4_ = uVar1;
        auVar29._24_4_ = uVar1;
        auVar29._28_4_ = uVar1;
        auVar129 = vmulps_avx512vl(auVar120,auVar29);
        uVar1 = *(undefined4 *)(lVar106 + uVar104 * 4);
        auVar30._4_4_ = uVar1;
        auVar30._0_4_ = uVar1;
        auVar30._8_4_ = uVar1;
        auVar30._12_4_ = uVar1;
        auVar30._16_4_ = uVar1;
        auVar30._20_4_ = uVar1;
        auVar30._24_4_ = uVar1;
        auVar30._28_4_ = uVar1;
        _local_28a0 = vfmadd231ps_avx512vl(auVar122,auVar121,auVar30);
        uVar1 = *(undefined4 *)(lVar106 + 4 + uVar104 * 4);
        auVar31._4_4_ = uVar1;
        auVar31._0_4_ = uVar1;
        auVar31._8_4_ = uVar1;
        auVar31._12_4_ = uVar1;
        auVar31._16_4_ = uVar1;
        auVar31._20_4_ = uVar1;
        auVar31._24_4_ = uVar1;
        auVar31._28_4_ = uVar1;
        _local_2860 = vfmadd231ps_avx512vl(auVar123,auVar121,auVar31);
        uVar1 = *(undefined4 *)(lVar106 + 8 + uVar104 * 4);
        auVar32._4_4_ = uVar1;
        auVar32._0_4_ = uVar1;
        auVar32._8_4_ = uVar1;
        auVar32._12_4_ = uVar1;
        auVar32._16_4_ = uVar1;
        auVar32._20_4_ = uVar1;
        auVar32._24_4_ = uVar1;
        auVar32._28_4_ = uVar1;
        _local_2880 = vfmadd231ps_avx512vl(auVar129,auVar121,auVar32);
        uVar104 = (ulong)*(uint *)(lVar109 + 0x30 + lVar111 * 4);
        uVar1 = *(undefined4 *)(lVar107 + uVar104 * 4);
        auVar33._4_4_ = uVar1;
        auVar33._0_4_ = uVar1;
        auVar33._8_4_ = uVar1;
        auVar33._12_4_ = uVar1;
        auVar33._16_4_ = uVar1;
        auVar33._20_4_ = uVar1;
        auVar33._24_4_ = uVar1;
        auVar33._28_4_ = uVar1;
        auVar122 = vmulps_avx512vl(auVar120,auVar33);
        uVar1 = *(undefined4 *)(lVar107 + 4 + uVar104 * 4);
        auVar34._4_4_ = uVar1;
        auVar34._0_4_ = uVar1;
        auVar34._8_4_ = uVar1;
        auVar34._12_4_ = uVar1;
        auVar34._16_4_ = uVar1;
        auVar34._20_4_ = uVar1;
        auVar34._24_4_ = uVar1;
        auVar34._28_4_ = uVar1;
        auVar123 = vmulps_avx512vl(auVar120,auVar34);
        uVar1 = *(undefined4 *)(lVar107 + 8 + uVar104 * 4);
        auVar35._4_4_ = uVar1;
        auVar35._0_4_ = uVar1;
        auVar35._8_4_ = uVar1;
        auVar35._12_4_ = uVar1;
        auVar35._16_4_ = uVar1;
        auVar35._20_4_ = uVar1;
        auVar35._24_4_ = uVar1;
        auVar35._28_4_ = uVar1;
        auVar120 = vmulps_avx512vl(auVar120,auVar35);
        uVar1 = *(undefined4 *)(lVar106 + uVar104 * 4);
        auVar36._4_4_ = uVar1;
        auVar36._0_4_ = uVar1;
        auVar36._8_4_ = uVar1;
        auVar36._12_4_ = uVar1;
        auVar36._16_4_ = uVar1;
        auVar36._20_4_ = uVar1;
        auVar36._24_4_ = uVar1;
        auVar36._28_4_ = uVar1;
        local_2b60 = vfmadd231ps_avx512vl(auVar122,auVar121,auVar36);
        uVar1 = *(undefined4 *)(lVar106 + 4 + uVar104 * 4);
        auVar37._4_4_ = uVar1;
        auVar37._0_4_ = uVar1;
        auVar37._8_4_ = uVar1;
        auVar37._12_4_ = uVar1;
        auVar37._16_4_ = uVar1;
        auVar37._20_4_ = uVar1;
        auVar37._24_4_ = uVar1;
        auVar37._28_4_ = uVar1;
        local_2b40 = vfmadd231ps_avx512vl(auVar123,auVar121,auVar37);
        uVar1 = *(undefined4 *)(lVar106 + 8 + uVar104 * 4);
        auVar38._4_4_ = uVar1;
        auVar38._0_4_ = uVar1;
        auVar38._8_4_ = uVar1;
        auVar38._12_4_ = uVar1;
        auVar38._16_4_ = uVar1;
        auVar38._20_4_ = uVar1;
        auVar38._24_4_ = uVar1;
        auVar38._28_4_ = uVar1;
        local_2aa0 = vfmadd231ps_avx512vl(auVar120,auVar121,auVar38);
      }
      else {
        while (fVar200 = fStack_2ae8, fVar199 = fStack_2aec, fVar198 = fStack_2af0,
              fVar197 = local_2b00[3], fVar196 = local_2b00[2], fVar192 = local_2b00[1],
              fVar204 = local_2b00[0], uVar116 != 0) {
          lVar106 = (long)*(int *)((long)&local_2bc0.valid + uVar104 * 4) * 0x38;
          uVar110 = (ulong)*(uint *)(lVar109 + lVar111 * 4);
          auVar117 = *(undefined1 (*) [16])
                      (*(long *)(*(long *)&pGVar6[2].numPrimitives + lVar106) + uVar110 * 4);
          auVar217 = ZEXT1664(auVar117);
          auVar157 = *(undefined1 (*) [16])
                      (*(long *)(*(long *)&pGVar6[2].numPrimitives + 0x38 + lVar106) + uVar110 * 4);
          *(int *)((long)&local_2a40 + uVar104 * 4) = auVar117._0_4_;
          uVar1 = vextractps_avx(auVar117,1);
          *(undefined4 *)((long)&local_2a40 + uVar104 * 4 + 0x20) = uVar1;
          uVar1 = vextractps_avx(auVar117,2);
          *(undefined4 *)((long)&local_2a40 + uVar104 * 4 + 0x40) = uVar1;
          local_2b00[uVar104] = auVar157._0_4_;
          fVar204 = (float)vextractps_avx(auVar157,1);
          local_2ae0[uVar104] = fVar204;
          fVar204 = (float)vextractps_avx(auVar157,2);
          local_2ac0[uVar104] = fVar204;
          uVar110 = uVar104 & 0x3f;
          uVar104 = 0;
          uVar116 = uVar116 ^ 1L << uVar110;
          for (uVar110 = uVar116; (uVar110 & 1) == 0; uVar110 = uVar110 >> 1 | 0x8000000000000000) {
            uVar104 = uVar104 + 1;
          }
        }
        auVar121 = vsubps_avx512vl(auVar119,auVar120);
        uVar1 = local_2a40._0_4_;
        uVar65 = local_2a40._4_4_;
        uVar67 = local_2a40._8_4_;
        uVar69 = local_2a40._12_4_;
        uVar71 = local_2a40._16_4_;
        uVar73 = local_2a40._20_4_;
        uVar75 = local_2a40._24_4_;
        uVar77 = local_2a40._28_4_;
        uVar78 = local_2a40._64_4_;
        uVar81 = local_2a40._68_4_;
        uVar84 = local_2a40._72_4_;
        uVar87 = local_2a40._76_4_;
        uVar90 = local_2a40._80_4_;
        uVar93 = local_2a40._84_4_;
        uVar96 = local_2a40._88_4_;
        uVar99 = local_2a40._92_4_;
        fVar168 = auVar121._0_4_;
        fVar172 = auVar121._4_4_;
        fVar173 = auVar121._8_4_;
        fVar174 = auVar121._12_4_;
        fVar175 = auVar121._16_4_;
        fVar176 = auVar121._20_4_;
        fVar177 = auVar121._24_4_;
        fVar156 = auVar120._0_4_;
        fVar160 = auVar120._4_4_;
        fVar161 = auVar120._8_4_;
        fVar162 = auVar120._12_4_;
        fVar163 = auVar120._16_4_;
        fVar164 = auVar120._20_4_;
        fVar165 = auVar120._24_4_;
        auVar124._0_4_ = fVar168 * (float)local_2a40._32_4_ + fVar156 * local_2ae0[0];
        auVar124._4_4_ = fVar172 * (float)local_2a40._36_4_ + fVar160 * local_2ae0[1];
        auVar124._8_4_ = fVar173 * (float)local_2a40._40_4_ + fVar161 * local_2ae0[2];
        auVar124._12_4_ = fVar174 * (float)local_2a40._44_4_ + fVar162 * local_2ae0[3];
        auVar124._16_4_ = fVar175 * (float)local_2a40._48_4_ + fVar163 * fStack_2ad0;
        auVar124._20_4_ = fVar176 * (float)local_2a40._52_4_ + fVar164 * fStack_2acc;
        auVar124._24_4_ = fVar177 * (float)local_2a40._56_4_ + fVar165 * fStack_2ac8;
        fVar16 = auVar181._28_4_;
        auVar124._28_4_ = auVar217._28_4_ + fVar16;
        fVar178 = fVar156 * local_2ac0[0];
        fVar182 = fVar160 * local_2ac0[1];
        fVar183 = fVar161 * local_2ac0[2];
        fVar184 = fVar162 * local_2ac0[3];
        fVar185 = fVar163 * fStack_2ab0;
        fVar186 = fVar164 * fStack_2aac;
        fVar187 = fVar165 * fStack_2aa8;
        uVar116 = local_2b78;
        uVar104 = local_2bc8;
        while (fVar212 = fStack_2ae8, fVar211 = fStack_2aec, fVar210 = fStack_2af0,
              fVar209 = local_2b00[3], fVar208 = local_2b00[2], fVar207 = local_2b00[1],
              fVar206 = local_2b00[0], uVar116 != 0) {
          lVar106 = (long)*(int *)((long)&local_2bc0.valid + uVar104 * 4) * 0x38;
          uVar110 = (ulong)*(uint *)(lVar109 + 0x10 + lVar111 * 4);
          auVar117 = *(undefined1 (*) [16])
                      (*(long *)(*(long *)&pGVar6[2].numPrimitives + lVar106) + uVar110 * 4);
          in_ZMM7 = ZEXT1664(auVar117);
          auVar157 = *(undefined1 (*) [16])
                      (*(long *)(*(long *)&pGVar6[2].numPrimitives + 0x38 + lVar106) + uVar110 * 4);
          *(int *)((long)&local_2a40 + uVar104 * 4) = auVar117._0_4_;
          uVar3 = vextractps_avx(auVar117,1);
          *(undefined4 *)((long)&local_2a40 + uVar104 * 4 + 0x20) = uVar3;
          uVar3 = vextractps_avx(auVar117,2);
          *(undefined4 *)((long)&local_2a40 + uVar104 * 4 + 0x40) = uVar3;
          local_2b00[uVar104] = auVar157._0_4_;
          fVar206 = (float)vextractps_avx(auVar157,1);
          local_2ae0[uVar104] = fVar206;
          fVar206 = (float)vextractps_avx(auVar157,2);
          local_2ac0[uVar104] = fVar206;
          uVar110 = uVar104 & 0x3f;
          uVar104 = 0;
          uVar116 = uVar116 ^ 1L << uVar110;
          for (uVar110 = uVar116; (uVar110 & 1) == 0; uVar110 = uVar110 >> 1 | 0x8000000000000000) {
            uVar104 = uVar104 + 1;
          }
        }
        uVar3 = local_2a40._0_4_;
        uVar66 = local_2a40._4_4_;
        uVar68 = local_2a40._8_4_;
        uVar70 = local_2a40._12_4_;
        uVar72 = local_2a40._16_4_;
        uVar74 = local_2a40._20_4_;
        uVar76 = local_2a40._24_4_;
        uVar79 = local_2a40._64_4_;
        uVar82 = local_2a40._68_4_;
        uVar85 = local_2a40._72_4_;
        uVar88 = local_2a40._76_4_;
        uVar91 = local_2a40._80_4_;
        uVar94 = local_2a40._84_4_;
        uVar97 = local_2a40._88_4_;
        uVar100 = local_2a40._92_4_;
        auVar125._0_4_ = fVar168 * (float)uVar1 + fVar156 * fVar204;
        auVar125._4_4_ = fVar172 * (float)uVar65 + fVar160 * fVar192;
        auVar125._8_4_ = fVar173 * (float)uVar67 + fVar161 * fVar196;
        auVar125._12_4_ = fVar174 * (float)uVar69 + fVar162 * fVar197;
        auVar125._16_4_ = fVar175 * (float)uVar71 + fVar163 * fVar198;
        auVar125._20_4_ = fVar176 * (float)uVar73 + fVar164 * fVar199;
        auVar125._24_4_ = fVar177 * (float)uVar75 + fVar165 * fVar200;
        fVar204 = in_ZMM7._28_4_;
        auVar125._28_4_ = (float)uVar77 + fVar204;
        auVar126._0_4_ = fVar168 * (float)local_2a40._32_4_ + fVar156 * local_2ae0[0];
        auVar126._4_4_ = fVar172 * (float)local_2a40._36_4_ + fVar160 * local_2ae0[1];
        auVar126._8_4_ = fVar173 * (float)local_2a40._40_4_ + fVar161 * local_2ae0[2];
        auVar126._12_4_ = fVar174 * (float)local_2a40._44_4_ + fVar162 * local_2ae0[3];
        auVar126._16_4_ = fVar175 * (float)local_2a40._48_4_ + fVar163 * fStack_2ad0;
        auVar126._20_4_ = fVar176 * (float)local_2a40._52_4_ + fVar164 * fStack_2acc;
        auVar126._24_4_ = fVar177 * (float)local_2a40._56_4_ + fVar165 * fStack_2ac8;
        auVar126._28_4_ = in_ZMM10._28_4_ + fVar204;
        fVar192 = fVar156 * local_2ac0[0];
        fVar196 = fVar160 * local_2ac0[1];
        fVar197 = fVar161 * local_2ac0[2];
        fVar198 = fVar162 * local_2ac0[3];
        fVar199 = fVar163 * fStack_2ab0;
        fVar200 = fVar164 * fStack_2aac;
        fVar201 = fVar165 * fStack_2aa8;
        uVar116 = local_2b78;
        uVar104 = local_2bc8;
        while (fVar64 = fStack_2ae8, fVar63 = fStack_2aec, fVar62 = fStack_2af0,
              fVar61 = local_2b00[3], fVar60 = local_2b00[2], fVar59 = local_2b00[1],
              fVar4 = local_2b00[0], uVar116 != 0) {
          lVar106 = (long)*(int *)((long)&local_2bc0.valid + uVar104 * 4) * 0x38;
          uVar110 = (ulong)*(uint *)(lVar109 + 0x20 + lVar111 * 4);
          auVar117 = *(undefined1 (*) [16])
                      (*(long *)(*(long *)&pGVar6[2].numPrimitives + lVar106) + uVar110 * 4);
          auVar157 = *(undefined1 (*) [16])
                      (*(long *)(*(long *)&pGVar6[2].numPrimitives + 0x38 + lVar106) + uVar110 * 4);
          in_ZMM11 = ZEXT1664(auVar157);
          *(int *)((long)&local_2a40 + uVar104 * 4) = auVar117._0_4_;
          uVar1 = vextractps_avx(auVar117,1);
          *(undefined4 *)((long)&local_2a40 + uVar104 * 4 + 0x20) = uVar1;
          uVar1 = vextractps_avx(auVar117,2);
          *(undefined4 *)((long)&local_2a40 + uVar104 * 4 + 0x40) = uVar1;
          local_2b00[uVar104] = auVar157._0_4_;
          fVar4 = (float)vextractps_avx(auVar157,1);
          local_2ae0[uVar104] = fVar4;
          fVar4 = (float)vextractps_avx(auVar157,2);
          local_2ac0[uVar104] = fVar4;
          uVar110 = uVar104 & 0x3f;
          uVar104 = 0;
          uVar116 = uVar116 ^ 1L << uVar110;
          for (uVar110 = uVar116; (uVar110 & 1) == 0; uVar110 = uVar110 >> 1 | 0x8000000000000000) {
            uVar104 = uVar104 + 1;
          }
        }
        uVar1 = local_2a40._0_4_;
        uVar65 = local_2a40._4_4_;
        uVar67 = local_2a40._8_4_;
        uVar69 = local_2a40._12_4_;
        uVar71 = local_2a40._16_4_;
        uVar73 = local_2a40._20_4_;
        uVar75 = local_2a40._24_4_;
        uVar77 = local_2a40._28_4_;
        uVar80 = local_2a40._64_4_;
        uVar83 = local_2a40._68_4_;
        uVar86 = local_2a40._72_4_;
        uVar89 = local_2a40._76_4_;
        uVar92 = local_2a40._80_4_;
        uVar95 = local_2a40._84_4_;
        uVar98 = local_2a40._88_4_;
        auVar130._0_4_ = (float)uVar3 * fVar168 + fVar206 * fVar156;
        auVar130._4_4_ = (float)uVar66 * fVar172 + fVar207 * fVar160;
        auVar130._8_4_ = (float)uVar68 * fVar173 + fVar208 * fVar161;
        auVar130._12_4_ = (float)uVar70 * fVar174 + fVar209 * fVar162;
        auVar130._16_4_ = (float)uVar72 * fVar175 + fVar210 * fVar163;
        auVar130._20_4_ = (float)uVar74 * fVar176 + fVar211 * fVar164;
        auVar130._24_4_ = (float)uVar76 * fVar177 + fVar212 * fVar165;
        auVar130._28_4_ = in_ZMM11._28_4_ + in_ZMM12._28_4_;
        fVar213 = in_ZMM13._28_4_ + in_ZMM11._28_4_;
        local_2860._4_4_ = fVar172 * (float)local_2a40._36_4_ + fVar160 * local_2ae0[1];
        local_2860._0_4_ = fVar168 * (float)local_2a40._32_4_ + fVar156 * local_2ae0[0];
        fStack_2858 = fVar173 * (float)local_2a40._40_4_ + fVar161 * local_2ae0[2];
        fStack_2854 = fVar174 * (float)local_2a40._44_4_ + fVar162 * local_2ae0[3];
        fStack_2850 = fVar175 * (float)local_2a40._48_4_ + fVar163 * fStack_2ad0;
        fStack_284c = fVar176 * (float)local_2a40._52_4_ + fVar164 * fStack_2acc;
        fStack_2848 = fVar177 * (float)local_2a40._56_4_ + fVar165 * fStack_2ac8;
        fStack_2844 = fVar213;
        fVar206 = fVar156 * local_2ac0[0];
        fVar207 = fVar160 * local_2ac0[1];
        fVar208 = fVar161 * local_2ac0[2];
        fVar209 = fVar162 * local_2ac0[3];
        fVar210 = fVar163 * fStack_2ab0;
        fVar211 = fVar164 * fStack_2aac;
        fVar212 = fVar165 * fStack_2aa8;
        uVar116 = local_2b78;
        uVar104 = local_2bc8;
        while (uVar116 != 0) {
          lVar106 = (long)*(int *)((long)&local_2bc0.valid + uVar104 * 4) * 0x38;
          uVar110 = (ulong)*(uint *)(lVar109 + 0x30 + lVar111 * 4);
          auVar117 = *(undefined1 (*) [16])
                      (*(long *)(*(long *)&pGVar6[2].numPrimitives + lVar106) + uVar110 * 4);
          auVar157 = *(undefined1 (*) [16])
                      (*(long *)(*(long *)&pGVar6[2].numPrimitives + 0x38 + lVar106) + uVar110 * 4);
          *(int *)((long)&local_2a40 + uVar104 * 4) = auVar117._0_4_;
          uVar3 = vextractps_avx(auVar117,1);
          *(undefined4 *)((long)&local_2a40 + uVar104 * 4 + 0x20) = uVar3;
          uVar3 = vextractps_avx(auVar117,2);
          *(undefined4 *)((long)&local_2a40 + uVar104 * 4 + 0x40) = uVar3;
          local_2b00[uVar104] = auVar157._0_4_;
          fVar5 = (float)vextractps_avx(auVar157,1);
          local_2ae0[uVar104] = fVar5;
          fVar5 = (float)vextractps_avx(auVar157,2);
          local_2ac0[uVar104] = fVar5;
          uVar110 = uVar104 & 0x3f;
          uVar104 = 0;
          uVar116 = uVar116 ^ 1L << uVar110;
          for (uVar110 = uVar116; (uVar110 & 1) == 0; uVar110 = uVar110 >> 1 | 0x8000000000000000) {
            uVar104 = uVar104 + 1;
          }
        }
        auVar128._0_4_ = fVar168 * (float)uVar78 + fVar178;
        auVar128._4_4_ = fVar172 * (float)uVar81 + fVar182;
        auVar128._8_4_ = fVar173 * (float)uVar84 + fVar183;
        auVar128._12_4_ = fVar174 * (float)uVar87 + fVar184;
        auVar128._16_4_ = fVar175 * (float)uVar90 + fVar185;
        auVar128._20_4_ = fVar176 * (float)uVar93 + fVar186;
        auVar128._24_4_ = fVar177 * (float)uVar96 + fVar187;
        auVar128._28_4_ = (float)uVar99 + fVar16;
        local_2680._0_4_ = fVar168 * (float)uVar79 + fVar192;
        local_2680._4_4_ = fVar172 * (float)uVar82 + fVar196;
        local_2680._8_4_ = fVar173 * (float)uVar85 + fVar197;
        local_2680._12_4_ = fVar174 * (float)uVar88 + fVar198;
        local_2680._16_4_ = fVar175 * (float)uVar91 + fVar199;
        local_2680._20_4_ = fVar176 * (float)uVar94 + fVar200;
        local_2680._24_4_ = fVar177 * (float)uVar97 + fVar201;
        local_2680._28_4_ = fVar16 + fVar204;
        fStack_2864 = fVar213 + (float)uVar100;
        local_2880._4_4_ = fVar207 + (float)uVar83 * fVar172;
        local_2880._0_4_ = fVar206 + (float)uVar80 * fVar168;
        fStack_2878 = fVar208 + (float)uVar86 * fVar173;
        fStack_2874 = fVar209 + (float)uVar89 * fVar174;
        fStack_2870 = fVar210 + (float)uVar92 * fVar175;
        fStack_286c = fVar211 + (float)uVar95 * fVar176;
        fStack_2868 = fVar212 + (float)uVar98 * fVar177;
        fStack_2884 = fVar16 + fStack_2864;
        local_28a0._4_4_ = (float)uVar65 * fVar172 + fVar59 * fVar160;
        local_28a0._0_4_ = (float)uVar1 * fVar168 + fVar4 * fVar156;
        fStack_2898 = (float)uVar67 * fVar173 + fVar60 * fVar161;
        fStack_2894 = (float)uVar69 * fVar174 + fVar61 * fVar162;
        fStack_2890 = (float)uVar71 * fVar175 + fVar62 * fVar163;
        fStack_288c = (float)uVar73 * fVar176 + fVar63 * fVar164;
        fStack_2888 = (float)uVar75 * fVar177 + fVar64 * fVar165;
        auVar129._4_4_ = fVar172 * (float)local_2a40._68_4_;
        auVar129._0_4_ = fVar168 * (float)local_2a40._64_4_;
        auVar129._8_4_ = fVar173 * (float)local_2a40._72_4_;
        auVar129._12_4_ = fVar174 * (float)local_2a40._76_4_;
        auVar129._16_4_ = fVar175 * (float)local_2a40._80_4_;
        auVar129._20_4_ = fVar176 * (float)local_2a40._84_4_;
        auVar129._24_4_ = fVar177 * (float)local_2a40._88_4_;
        auVar129._28_4_ = auVar121._28_4_;
        local_2b60._0_4_ = fVar168 * (float)local_2a40._0_4_ + fVar156 * local_2b00[0];
        local_2b60._4_4_ = fVar172 * (float)local_2a40._4_4_ + fVar160 * local_2b00[1];
        local_2b60._8_4_ = fVar173 * (float)local_2a40._8_4_ + fVar161 * local_2b00[2];
        local_2b60._12_4_ = fVar174 * (float)local_2a40._12_4_ + fVar162 * local_2b00[3];
        local_2b60._16_4_ = fVar175 * (float)local_2a40._16_4_ + fVar163 * fStack_2af0;
        local_2b60._20_4_ = fVar176 * (float)local_2a40._20_4_ + fVar164 * fStack_2aec;
        local_2b60._24_4_ = fVar177 * (float)local_2a40._24_4_ + fVar165 * fStack_2ae8;
        local_2b60._28_4_ = fVar204 + fStack_2884;
        local_2b40._0_4_ = fVar168 * (float)local_2a40._32_4_ + fVar156 * local_2ae0[0];
        local_2b40._4_4_ = fVar172 * (float)local_2a40._36_4_ + fVar160 * local_2ae0[1];
        local_2b40._8_4_ = fVar173 * (float)local_2a40._40_4_ + fVar161 * local_2ae0[2];
        local_2b40._12_4_ = fVar174 * (float)local_2a40._44_4_ + fVar162 * local_2ae0[3];
        local_2b40._16_4_ = fVar175 * (float)local_2a40._48_4_ + fVar163 * fStack_2ad0;
        local_2b40._20_4_ = fVar176 * (float)local_2a40._52_4_ + fVar164 * fStack_2acc;
        local_2b40._24_4_ = fVar177 * (float)local_2a40._56_4_ + fVar165 * fStack_2ac8;
        local_2b40._28_4_ = (float)uVar77 + fStack_2884;
        auVar146._4_4_ = fVar160 * local_2ac0[1];
        auVar146._0_4_ = fVar156 * local_2ac0[0];
        auVar146._8_4_ = fVar161 * local_2ac0[2];
        auVar146._12_4_ = fVar162 * local_2ac0[3];
        auVar146._16_4_ = fVar163 * fStack_2ab0;
        auVar146._20_4_ = fVar164 * fStack_2aac;
        auVar146._24_4_ = fVar165 * fStack_2aa8;
        auVar146._28_4_ = auVar120._28_4_;
        local_2aa0 = vaddps_avx512vl(auVar129,auVar146);
      }
      auVar120 = *(undefined1 (*) [32])ray;
      auVar121 = *(undefined1 (*) [32])(ray + 0x20);
      auVar122 = *(undefined1 (*) [32])(ray + 0x40);
      auVar123 = *(undefined1 (*) [32])(ray + 0x80);
      auVar129 = *(undefined1 (*) [32])(ray + 0xa0);
      auVar146 = *(undefined1 (*) [32])(ray + 0xc0);
      auVar125 = vsubps_avx(auVar125,auVar120);
      auVar124 = vsubps_avx(auVar124,auVar121);
      auVar128 = vsubps_avx(auVar128,auVar122);
      local_2660 = auVar130;
      auVar130 = vsubps_avx(auVar130,auVar120);
      local_2640 = auVar126;
      auVar126 = vsubps_avx512vl(auVar126,auVar121);
      auVar131 = vsubps_avx512vl(local_2680,auVar122);
      auVar132 = vsubps_avx512vl(local_2b60,auVar120);
      auVar133 = vsubps_avx512vl(local_2b40,auVar121);
      auVar122 = vsubps_avx512vl(local_2aa0,auVar122);
      auVar134 = vsubps_avx512vl(auVar132,auVar125);
      auVar135 = vsubps_avx512vl(auVar133,auVar124);
      auVar136 = vsubps_avx512vl(auVar122,auVar128);
      in_ZMM12 = ZEXT3264(auVar136);
      auVar120 = vsubps_avx(auVar125,auVar130);
      in_ZMM15 = ZEXT3264(auVar120);
      auVar137 = vsubps_avx512vl(auVar124,auVar126);
      auVar138 = vsubps_avx512vl(auVar128,auVar131);
      auVar139 = vaddps_avx512vl(auVar132,auVar125);
      auVar140 = vaddps_avx512vl(auVar133,auVar124);
      auVar141 = vaddps_avx512vl(auVar122,auVar128);
      auVar44._4_4_ = auVar136._4_4_ * auVar140._4_4_;
      auVar44._0_4_ = auVar136._0_4_ * auVar140._0_4_;
      auVar44._8_4_ = auVar136._8_4_ * auVar140._8_4_;
      auVar44._12_4_ = auVar136._12_4_ * auVar140._12_4_;
      auVar44._16_4_ = auVar136._16_4_ * auVar140._16_4_;
      auVar44._20_4_ = auVar136._20_4_ * auVar140._20_4_;
      auVar44._24_4_ = auVar136._24_4_ * auVar140._24_4_;
      auVar44._28_4_ = auVar121._28_4_;
      auVar157 = vfmsub231ps_fma(auVar44,auVar135,auVar141);
      auVar45._4_4_ = auVar134._4_4_ * auVar141._4_4_;
      auVar45._0_4_ = auVar134._0_4_ * auVar141._0_4_;
      auVar45._8_4_ = auVar134._8_4_ * auVar141._8_4_;
      auVar45._12_4_ = auVar134._12_4_ * auVar141._12_4_;
      auVar45._16_4_ = auVar134._16_4_ * auVar141._16_4_;
      auVar45._20_4_ = auVar134._20_4_ * auVar141._20_4_;
      auVar45._24_4_ = auVar134._24_4_ * auVar141._24_4_;
      auVar45._28_4_ = auVar141._28_4_;
      auVar117 = vfmsub231ps_fma(auVar45,auVar136,auVar139);
      auVar46._4_4_ = auVar135._4_4_ * auVar139._4_4_;
      auVar46._0_4_ = auVar135._0_4_ * auVar139._0_4_;
      auVar46._8_4_ = auVar135._8_4_ * auVar139._8_4_;
      auVar46._12_4_ = auVar135._12_4_ * auVar139._12_4_;
      auVar46._16_4_ = auVar135._16_4_ * auVar139._16_4_;
      auVar46._20_4_ = auVar135._20_4_ * auVar139._20_4_;
      auVar46._24_4_ = auVar135._24_4_ * auVar139._24_4_;
      auVar46._28_4_ = auVar139._28_4_;
      auVar166 = vfmsub231ps_fma(auVar46,auVar134,auVar140);
      fVar204 = auVar146._0_4_;
      auVar158._0_4_ = fVar204 * auVar166._0_4_;
      fVar192 = auVar146._4_4_;
      auVar158._4_4_ = fVar192 * auVar166._4_4_;
      fVar196 = auVar146._8_4_;
      auVar158._8_4_ = fVar196 * auVar166._8_4_;
      fVar197 = auVar146._12_4_;
      auVar158._12_4_ = fVar197 * auVar166._12_4_;
      fVar198 = auVar146._16_4_;
      auVar158._16_4_ = fVar198 * 0.0;
      fVar199 = auVar146._20_4_;
      auVar158._20_4_ = fVar199 * 0.0;
      fVar200 = auVar146._24_4_;
      auVar158._24_4_ = fVar200 * 0.0;
      auVar158._28_4_ = 0;
      auVar117 = vfmadd231ps_fma(auVar158,auVar129,ZEXT1632(auVar117));
      auVar117 = vfmadd231ps_fma(ZEXT1632(auVar117),auVar123,ZEXT1632(auVar157));
      auVar167._0_4_ = auVar130._0_4_ + auVar125._0_4_;
      auVar167._4_4_ = auVar130._4_4_ + auVar125._4_4_;
      auVar167._8_4_ = auVar130._8_4_ + auVar125._8_4_;
      auVar167._12_4_ = auVar130._12_4_ + auVar125._12_4_;
      auVar167._16_4_ = auVar130._16_4_ + auVar125._16_4_;
      auVar167._20_4_ = auVar130._20_4_ + auVar125._20_4_;
      auVar167._24_4_ = auVar130._24_4_ + auVar125._24_4_;
      auVar167._28_4_ = auVar130._28_4_ + auVar125._28_4_;
      auVar121 = vaddps_avx512vl(auVar124,auVar126);
      auVar139 = vaddps_avx512vl(auVar128,auVar131);
      auVar140 = vmulps_avx512vl(auVar121,auVar138);
      auVar140 = vfmsub231ps_avx512vl(auVar140,auVar137,auVar139);
      auVar139 = vmulps_avx512vl(auVar139,auVar120);
      auVar139 = vfmsub231ps_avx512vl(auVar139,auVar138,auVar167);
      auVar141 = vmulps_avx512vl(auVar167,auVar137);
      auVar157 = vfmsub231ps_fma(auVar141,auVar120,auVar121);
      auVar121 = vsubps_avx512vl(auVar130,auVar132);
      auVar195._0_4_ = fVar204 * auVar157._0_4_;
      auVar195._4_4_ = fVar192 * auVar157._4_4_;
      auVar195._8_4_ = fVar196 * auVar157._8_4_;
      auVar195._12_4_ = fVar197 * auVar157._12_4_;
      auVar195._16_4_ = fVar198 * 0.0;
      auVar195._20_4_ = fVar199 * 0.0;
      auVar195._24_4_ = fVar200 * 0.0;
      auVar195._28_4_ = 0;
      auVar139 = vfmadd231ps_avx512vl(auVar195,auVar129,auVar139);
      auVar141 = vsubps_avx512vl(auVar126,auVar133);
      auVar157 = vfmadd231ps_fma(auVar139,auVar123,auVar140);
      in_ZMM7 = ZEXT1664(auVar157);
      auVar139 = vsubps_avx512vl(auVar131,auVar122);
      in_ZMM10 = ZEXT3264(auVar139);
      auVar130 = vaddps_avx512vl(auVar130,auVar132);
      auVar126 = vaddps_avx512vl(auVar126,auVar133);
      auVar122 = vaddps_avx512vl(auVar131,auVar122);
      auVar131 = vmulps_avx512vl(auVar126,auVar139);
      auVar131 = vfmsub231ps_avx512vl(auVar131,auVar141,auVar122);
      auVar122 = vmulps_avx512vl(auVar122,auVar121);
      auVar122 = vfmsub231ps_avx512vl(auVar122,auVar139,auVar130);
      auVar47._4_4_ = auVar130._4_4_ * auVar141._4_4_;
      auVar47._0_4_ = auVar130._0_4_ * auVar141._0_4_;
      auVar47._8_4_ = auVar130._8_4_ * auVar141._8_4_;
      auVar47._12_4_ = auVar130._12_4_ * auVar141._12_4_;
      auVar47._16_4_ = auVar130._16_4_ * auVar141._16_4_;
      auVar47._20_4_ = auVar130._20_4_ * auVar141._20_4_;
      auVar47._24_4_ = auVar130._24_4_ * auVar141._24_4_;
      auVar47._28_4_ = auVar130._28_4_;
      auVar126 = vfmsub231ps_avx512vl(auVar47,auVar121,auVar126);
      auVar126 = vmulps_avx512vl(auVar126,auVar146);
      auVar122 = vfmadd231ps_avx512vl(auVar126,auVar129,auVar122);
      auVar122 = vfmadd231ps_avx512vl(auVar122,auVar123,auVar131);
      auVar126 = vaddps_avx512vl(auVar122,ZEXT1632(CONCAT412(auVar117._12_4_ + auVar157._12_4_,
                                                             CONCAT48(auVar117._8_4_ +
                                                                      auVar157._8_4_,
                                                                      CONCAT44(auVar117._4_4_ +
                                                                               auVar157._4_4_,
                                                                               auVar117._0_4_ +
                                                                               auVar157._0_4_)))));
      in_ZMM14 = ZEXT3264(auVar126);
      auVar133 = auVar220._0_32_;
      vandps_avx512vl(auVar126,auVar133);
      auVar130 = vmulps_avx512vl(auVar126,auVar219._0_32_);
      auVar131 = vminps_avx512vl(ZEXT1632(auVar117),ZEXT1632(auVar157));
      auVar131 = vminps_avx512vl(auVar131,auVar122);
      auVar132 = vxorps_avx512vl(auVar130,auVar218._0_32_);
      uVar18 = vcmpps_avx512vl(auVar131,auVar132,5);
      auVar131 = vmaxps_avx512vl(ZEXT1632(auVar117),ZEXT1632(auVar157));
      auVar122 = vmaxps_avx512vl(auVar131,auVar122);
      uVar19 = vcmpps_avx512vl(auVar122,auVar130,2);
      bVar114 = ((byte)uVar18 | (byte)uVar19) & (byte)uVar105;
      if (bVar114 == 0) {
LAB_01d0bbfa:
        auVar181 = ZEXT3264(local_2b60);
        in_ZMM11 = ZEXT3264(local_2b40);
        in_ZMM13 = ZEXT3264(local_2aa0);
      }
      else {
        auVar122 = vmulps_avx512vl(auVar137,auVar136);
        auVar130 = vmulps_avx512vl(auVar134,auVar138);
        auVar131 = vmulps_avx512vl(auVar120,auVar135);
        auVar132 = vmulps_avx512vl(auVar141,auVar138);
        auVar140 = vmulps_avx512vl(auVar120,auVar139);
        auVar142 = vmulps_avx512vl(auVar121,auVar137);
        auVar135 = vfmsub213ps_avx512vl(auVar135,auVar138,auVar122);
        auVar136 = vfmsub213ps_avx512vl(auVar136,auVar120,auVar130);
        in_ZMM12 = ZEXT3264(auVar136);
        auVar134 = vfmsub213ps_avx512vl(auVar134,auVar137,auVar131);
        auVar137 = vfmsub213ps_avx512vl(auVar139,auVar137,auVar132);
        auVar121 = vfmsub213ps_avx512vl(auVar121,auVar138,auVar140);
        auVar120 = vfmsub213ps_avx512vl(auVar141,auVar120,auVar142);
        vandps_avx512vl(auVar122,auVar133);
        vandps_avx512vl(auVar132,auVar133);
        uVar104 = vcmpps_avx512vl(auVar120,auVar120,1);
        vandps_avx512vl(auVar130,auVar133);
        vandps_avx512vl(auVar140,auVar133);
        uVar116 = vcmpps_avx512vl(auVar120,auVar120,1);
        vandps_avx512vl(auVar131,auVar133);
        in_ZMM15 = ZEXT3264(auVar120);
        vandps_avx512vl(auVar142,auVar133);
        auVar122 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
        auVar218 = ZEXT3264(auVar122);
        uVar110 = vcmpps_avx512vl(auVar120,auVar120,1);
        bVar102 = (bool)((byte)uVar104 & 1);
        auVar118._0_4_ = (uint)bVar102 * auVar135._0_4_ | (uint)!bVar102 * auVar137._0_4_;
        bVar102 = (bool)((byte)(uVar104 >> 1) & 1);
        auVar118._4_4_ = (uint)bVar102 * auVar135._4_4_ | (uint)!bVar102 * auVar137._4_4_;
        bVar102 = (bool)((byte)(uVar104 >> 2) & 1);
        auVar118._8_4_ = (uint)bVar102 * auVar135._8_4_ | (uint)!bVar102 * auVar137._8_4_;
        bVar102 = (bool)((byte)(uVar104 >> 3) & 1);
        auVar118._12_4_ = (uint)bVar102 * auVar135._12_4_ | (uint)!bVar102 * auVar137._12_4_;
        bVar102 = (bool)((byte)(uVar104 >> 4) & 1);
        vVar143.field_0._16_4_ = (uint)bVar102 * auVar135._16_4_ | (uint)!bVar102 * auVar137._16_4_;
        vVar143.field_0._0_16_ = auVar118;
        bVar102 = (bool)((byte)(uVar104 >> 5) & 1);
        vVar143.field_0._20_4_ = (uint)bVar102 * auVar135._20_4_ | (uint)!bVar102 * auVar137._20_4_;
        bVar102 = (bool)((byte)(uVar104 >> 6) & 1);
        vVar143.field_0._24_4_ = (uint)bVar102 * auVar135._24_4_ | (uint)!bVar102 * auVar137._24_4_;
        bVar102 = SUB81(uVar104 >> 7,0);
        vVar143.field_0._28_4_ = (uint)bVar102 * auVar135._28_4_ | (uint)!bVar102 * auVar137._28_4_;
        in_ZMM10 = ZEXT3264((undefined1  [32])vVar143.field_0);
        bVar102 = (bool)((byte)uVar116 & 1);
        vVar144.field_0._0_4_ = (uint)bVar102 * auVar136._0_4_ | (uint)!bVar102 * auVar121._0_4_;
        bVar102 = (bool)((byte)(uVar116 >> 1) & 1);
        vVar144.field_0._4_4_ = (uint)bVar102 * auVar136._4_4_ | (uint)!bVar102 * auVar121._4_4_;
        bVar102 = (bool)((byte)(uVar116 >> 2) & 1);
        vVar144.field_0._8_4_ = (uint)bVar102 * auVar136._8_4_ | (uint)!bVar102 * auVar121._8_4_;
        bVar102 = (bool)((byte)(uVar116 >> 3) & 1);
        vVar144.field_0._12_4_ = (uint)bVar102 * auVar136._12_4_ | (uint)!bVar102 * auVar121._12_4_;
        bVar102 = (bool)((byte)(uVar116 >> 4) & 1);
        vVar144.field_0._16_4_ = (uint)bVar102 * auVar136._16_4_ | (uint)!bVar102 * auVar121._16_4_;
        bVar102 = (bool)((byte)(uVar116 >> 5) & 1);
        vVar144.field_0._20_4_ = (uint)bVar102 * auVar136._20_4_ | (uint)!bVar102 * auVar121._20_4_;
        bVar102 = (bool)((byte)(uVar116 >> 6) & 1);
        vVar144.field_0._24_4_ = (uint)bVar102 * auVar136._24_4_ | (uint)!bVar102 * auVar121._24_4_;
        bVar102 = SUB81(uVar116 >> 7,0);
        vVar144.field_0._28_4_ = (uint)bVar102 * auVar136._28_4_ | (uint)!bVar102 * auVar121._28_4_;
        bVar102 = (bool)((byte)uVar110 & 1);
        vVar145.field_0._0_4_ =
             (float)((uint)bVar102 * auVar134._0_4_ | (uint)!bVar102 * auVar120._0_4_);
        bVar102 = (bool)((byte)(uVar110 >> 1) & 1);
        vVar145.field_0._4_4_ =
             (float)((uint)bVar102 * auVar134._4_4_ | (uint)!bVar102 * auVar120._4_4_);
        bVar102 = (bool)((byte)(uVar110 >> 2) & 1);
        vVar145.field_0._8_4_ =
             (float)((uint)bVar102 * auVar134._8_4_ | (uint)!bVar102 * auVar120._8_4_);
        bVar102 = (bool)((byte)(uVar110 >> 3) & 1);
        vVar145.field_0._12_4_ =
             (float)((uint)bVar102 * auVar134._12_4_ | (uint)!bVar102 * auVar120._12_4_);
        bVar102 = (bool)((byte)(uVar110 >> 4) & 1);
        vVar145.field_0._16_4_ =
             (float)((uint)bVar102 * auVar134._16_4_ | (uint)!bVar102 * auVar120._16_4_);
        bVar102 = (bool)((byte)(uVar110 >> 5) & 1);
        vVar145.field_0._20_4_ =
             (float)((uint)bVar102 * auVar134._20_4_ | (uint)!bVar102 * auVar120._20_4_);
        bVar102 = (bool)((byte)(uVar110 >> 6) & 1);
        vVar145.field_0._24_4_ =
             (float)((uint)bVar102 * auVar134._24_4_ | (uint)!bVar102 * auVar120._24_4_);
        bVar102 = SUB81(uVar110 >> 7,0);
        vVar145.field_0._28_4_ = (uint)bVar102 * auVar134._28_4_ | (uint)!bVar102 * auVar120._28_4_;
        auVar48._4_4_ = fVar192 * vVar145.field_0._4_4_;
        auVar48._0_4_ = fVar204 * vVar145.field_0._0_4_;
        auVar48._8_4_ = fVar196 * vVar145.field_0._8_4_;
        auVar48._12_4_ = fVar197 * vVar145.field_0._12_4_;
        auVar48._16_4_ = fVar198 * vVar145.field_0._16_4_;
        auVar48._20_4_ = fVar199 * vVar145.field_0._20_4_;
        auVar48._24_4_ = fVar200 * vVar145.field_0._24_4_;
        auVar48._28_4_ = auVar146._28_4_;
        auVar166 = vfmadd213ps_fma(auVar129,(undefined1  [32])vVar144.field_0,auVar48);
        auVar166 = vfmadd213ps_fma(auVar123,(undefined1  [32])vVar143.field_0,ZEXT1632(auVar166));
        auVar130 = ZEXT1632(CONCAT412(auVar166._12_4_ + auVar166._12_4_,
                                      CONCAT48(auVar166._8_4_ + auVar166._8_4_,
                                               CONCAT44(auVar166._4_4_ + auVar166._4_4_,
                                                        auVar166._0_4_ + auVar166._0_4_))));
        auVar190._0_4_ = auVar128._0_4_ * vVar145.field_0._0_4_;
        auVar190._4_4_ = auVar128._4_4_ * vVar145.field_0._4_4_;
        auVar190._8_4_ = auVar128._8_4_ * vVar145.field_0._8_4_;
        auVar190._12_4_ = auVar128._12_4_ * vVar145.field_0._12_4_;
        auVar190._16_4_ = auVar128._16_4_ * vVar145.field_0._16_4_;
        auVar190._20_4_ = auVar128._20_4_ * vVar145.field_0._20_4_;
        auVar190._24_4_ = auVar128._24_4_ * vVar145.field_0._24_4_;
        auVar190._28_4_ = 0;
        auVar166 = vfmadd213ps_fma(auVar124,(undefined1  [32])vVar144.field_0,auVar190);
        auVar193 = vfmadd213ps_fma(auVar125,(undefined1  [32])vVar143.field_0,ZEXT1632(auVar166));
        auVar121 = vrcp14ps_avx512vl(auVar130);
        auVar122 = vxorps_avx512vl(auVar130,auVar122);
        auVar123 = vfnmadd213ps_avx512vl(auVar121,auVar130,auVar119);
        auVar166 = vfmadd132ps_fma(auVar123,auVar121,auVar121);
        local_29e0 = ZEXT1632(CONCAT412(auVar166._12_4_ * (auVar193._12_4_ + auVar193._12_4_),
                                        CONCAT48(auVar166._8_4_ * (auVar193._8_4_ + auVar193._8_4_),
                                                 CONCAT44(auVar166._4_4_ *
                                                          (auVar193._4_4_ + auVar193._4_4_),
                                                          auVar166._0_4_ *
                                                          (auVar193._0_4_ + auVar193._0_4_)))));
        uVar18 = vcmpps_avx512vl(local_29e0,*(undefined1 (*) [32])(ray + 0x100),2);
        uVar19 = vcmpps_avx512vl(local_29e0,*(undefined1 (*) [32])(ray + 0x60),0xd);
        uVar20 = vcmpps_avx512vl(auVar130,auVar122,4);
        bVar114 = bVar114 & (byte)uVar18 & (byte)uVar19 & (byte)uVar20;
        if (bVar114 == 0) goto LAB_01d0bbfa;
        uVar113 = pGVar6->mask;
        auVar170._4_4_ = uVar113;
        auVar170._0_4_ = uVar113;
        auVar170._8_4_ = uVar113;
        auVar170._12_4_ = uVar113;
        auVar170._16_4_ = uVar113;
        auVar170._20_4_ = uVar113;
        auVar170._24_4_ = uVar113;
        auVar170._28_4_ = uVar113;
        uVar18 = vptestmd_avx512vl(auVar170,*(undefined1 (*) [32])(ray + 0x120));
        bVar114 = bVar114 & (byte)uVar18;
        auVar181 = ZEXT3264(local_2b60);
        in_ZMM11 = ZEXT3264(local_2b40);
        in_ZMM13 = ZEXT3264(local_2aa0);
        if (bVar114 != 0) {
          if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
             (pGVar6->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
            auVar40._8_4_ = 0x219392ef;
            auVar40._0_8_ = 0x219392ef219392ef;
            auVar40._12_4_ = 0x219392ef;
            auVar40._16_4_ = 0x219392ef;
            auVar40._20_4_ = 0x219392ef;
            auVar40._24_4_ = 0x219392ef;
            auVar40._28_4_ = 0x219392ef;
            uVar105 = vcmpps_avx512vl(auVar126,auVar40,5);
            auVar121 = vrcp14ps_avx512vl(auVar126);
            auVar122 = vfnmadd213ps_avx512vl(auVar126,auVar121,auVar119);
            auVar122 = vfmadd132ps_avx512vl(auVar122,auVar121,auVar121);
            fVar200 = (float)((uint)((byte)uVar105 & 1) * auVar122._0_4_);
            fVar204 = (float)((uint)((byte)(uVar105 >> 1) & 1) * auVar122._4_4_);
            fVar192 = (float)((uint)((byte)(uVar105 >> 2) & 1) * auVar122._8_4_);
            fVar196 = (float)((uint)((byte)(uVar105 >> 3) & 1) * auVar122._12_4_);
            fVar197 = (float)((uint)((byte)(uVar105 >> 4) & 1) * auVar122._16_4_);
            fVar198 = (float)((uint)((byte)(uVar105 >> 5) & 1) * auVar122._20_4_);
            fVar199 = (float)((uint)((byte)(uVar105 >> 6) & 1) * auVar122._24_4_);
            auVar159._0_4_ = fVar200 * auVar117._0_4_;
            auVar159._4_4_ = fVar204 * auVar117._4_4_;
            auVar159._8_4_ = fVar192 * auVar117._8_4_;
            auVar159._12_4_ = fVar196 * auVar117._12_4_;
            auVar159._16_4_ = fVar197 * 0.0;
            auVar159._20_4_ = fVar198 * 0.0;
            auVar159._24_4_ = fVar199 * 0.0;
            auVar159._28_4_ = 0;
            local_29a0 = vminps_avx512vl(auVar159,auVar119);
            auVar53._4_4_ = fVar204 * auVar157._4_4_;
            auVar53._0_4_ = fVar200 * auVar157._0_4_;
            auVar53._8_4_ = fVar192 * auVar157._8_4_;
            auVar53._12_4_ = fVar196 * auVar157._12_4_;
            auVar53._16_4_ = fVar197 * 0.0;
            auVar53._20_4_ = fVar198 * 0.0;
            auVar53._24_4_ = fVar199 * 0.0;
            auVar53._28_4_ = auVar121._28_4_;
            local_29c0 = vminps_avx512vl(auVar53,auVar119);
            local_2bc0.geometryUserPtr = local_2900;
            local_2bc0.valid = (int *)local_2b00;
            local_2bc0.context = (RTCRayQueryContext *)local_28e0;
            local_2bc0.ray = (RTCRayN *)local_28c0;
            in_ZMM7 = ZEXT1664(auVar157);
            in_ZMM10 = ZEXT1664(auVar118);
            in_ZMM12 = ZEXT1664(auVar136._0_16_);
            in_ZMM14 = ZEXT1664(CONCAT412(fVar196,CONCAT48(fVar192,CONCAT44(fVar204,fVar200))));
            in_ZMM15 = ZEXT1664(auVar120._0_16_);
            local_2b18 = pGVar6;
            local_2a40.field_0.x.field_0 = (vfloat_impl<8>)(undefined1  [32])vVar143.field_0;
            local_2a40.field_0.y.field_0 = (vfloat_impl<8>)(undefined1  [32])vVar144.field_0;
            local_2a40.field_0.z.field_0 = (vfloat_impl<8>)(undefined1  [32])vVar145.field_0;
            std::
            _Tuple_impl<0ul,embree::vfloat_impl<8>&,embree::vfloat_impl<8>&,embree::vfloat_impl<8>&,embree::Vec3<embree::vfloat_impl<8>>&>
            ::
            _M_assign<embree::vfloat_impl<8>,embree::vfloat_impl<8>,embree::vfloat_impl<8>,embree::Vec3<embree::vfloat_impl<8>>>
                      ((_Tuple_impl<0UL,_embree::vfloat_impl<8>_&,_embree::vfloat_impl<8>_&,_embree::vfloat_impl<8>_&,_embree::Vec3<embree::vfloat_impl<8>_>_&>
                        *)&local_2bc0,
                       (_Tuple_impl<0UL,_embree::vfloat_impl<8>,_embree::vfloat_impl<8>,_embree::vfloat_impl<8>,_embree::Vec3<embree::vfloat_impl<8>_>_>
                        *)&local_2a40.field_0);
            pRVar7 = context->user;
            local_2980 = vpbroadcastd_avx512vl();
            local_29a0 = vpbroadcastd_avx512vl();
            local_2a40._4_4_ = local_2b00[1];
            local_2a40._0_4_ = local_2b00[0];
            local_2a40._12_4_ = local_2b00[3];
            local_2a40._8_4_ = local_2b00[2];
            local_2a40._20_4_ = fStack_2aec;
            local_2a40._16_4_ = fStack_2af0;
            local_2a40._28_4_ = uStack_2ae4;
            local_2a40._24_4_ = fStack_2ae8;
            local_2a40._36_4_ = local_2ae0[1];
            local_2a40._32_4_ = local_2ae0[0];
            local_2a40._40_4_ = local_2ae0[2];
            local_2a40._44_4_ = local_2ae0[3];
            local_2a40._48_4_ = fStack_2ad0;
            local_2a40._52_4_ = fStack_2acc;
            local_2a40._56_4_ = fStack_2ac8;
            local_2a40._60_4_ = uStack_2ac4;
            local_2a40._68_4_ = local_2ac0[1];
            local_2a40._64_4_ = local_2ac0[0];
            local_2a40._76_4_ = local_2ac0[3];
            local_2a40._72_4_ = local_2ac0[2];
            local_2a40._84_4_ = fStack_2aac;
            local_2a40._80_4_ = fStack_2ab0;
            local_2a40._92_4_ = uStack_2aa4;
            local_2a40._88_4_ = fStack_2aa8;
            local_29c0 = local_28e0;
            auVar119 = vpcmpeqd_avx2(local_2980,local_2980);
            local_2b10[1] = auVar119;
            *local_2b10 = auVar119;
            local_2960 = pRVar7->instID[0];
            uStack_295c = local_2960;
            uStack_2958 = local_2960;
            uStack_2954 = local_2960;
            uStack_2950 = local_2960;
            uStack_294c = local_2960;
            uStack_2948 = local_2960;
            uStack_2944 = local_2960;
            local_2940 = pRVar7->instPrimID[0];
            uStack_293c = local_2940;
            uStack_2938 = local_2940;
            uStack_2934 = local_2940;
            uStack_2930 = local_2940;
            uStack_292c = local_2940;
            uStack_2928 = local_2940;
            uStack_2924 = local_2940;
            local_2920 = *(undefined1 (*) [32])(ray + 0x100);
            auVar119 = vblendmps_avx512vl(local_2920,local_2900);
            bVar102 = (bool)(bVar114 >> 1 & 1);
            bVar9 = (bool)(bVar114 >> 2 & 1);
            bVar10 = (bool)(bVar114 >> 3 & 1);
            bVar11 = (bool)(bVar114 >> 4 & 1);
            bVar12 = (bool)(bVar114 >> 5 & 1);
            bVar13 = (bool)(bVar114 >> 6 & 1);
            *(uint *)(ray + 0x100) =
                 (uint)(bVar114 & 1) * auVar119._0_4_ | !(bool)(bVar114 & 1) * local_2940;
            *(uint *)(ray + 0x104) = (uint)bVar102 * auVar119._4_4_ | !bVar102 * local_2940;
            *(uint *)(ray + 0x108) = (uint)bVar9 * auVar119._8_4_ | !bVar9 * local_2940;
            *(uint *)(ray + 0x10c) = (uint)bVar10 * auVar119._12_4_ | !bVar10 * local_2940;
            *(uint *)(ray + 0x110) = (uint)bVar11 * auVar119._16_4_ | !bVar11 * local_2940;
            *(uint *)(ray + 0x114) = (uint)bVar12 * auVar119._20_4_ | !bVar12 * local_2940;
            *(uint *)(ray + 0x118) = (uint)bVar13 * auVar119._24_4_ | !bVar13 * local_2940;
            *(uint *)(ray + 0x11c) =
                 (uint)(bVar114 >> 7) * auVar119._28_4_ | !(bool)(bVar114 >> 7) * local_2940;
            local_2a80 = vpmovm2d_avx512vl((ulong)bVar114);
            local_2bc0.geometryUserPtr = local_2b18->userPtr;
            local_2bc0.valid = (int *)local_2a80;
            local_2bc0.context = context->user;
            local_2bc0.ray = (RTCRayN *)ray;
            local_2bc0.hit = (RTCHitN *)&local_2a40;
            local_2bc0.N = 8;
            if (local_2b18->occlusionFilterN != (RTCFilterFunctionN)0x0) {
              in_ZMM7 = ZEXT1664(in_ZMM7._0_16_);
              in_ZMM10 = ZEXT1664(in_ZMM10._0_16_);
              in_ZMM12 = ZEXT1664(in_ZMM12._0_16_);
              in_ZMM14 = ZEXT1664(in_ZMM14._0_16_);
              in_ZMM15 = ZEXT1664(in_ZMM15._0_16_);
              (*local_2b18->occlusionFilterN)(&local_2bc0);
            }
            if (local_2a80 == (undefined1  [32])0x0) {
              uVar105 = 0;
              auVar119 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
              auVar220 = ZEXT3264(auVar119);
              auVar119 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
              auVar221 = ZEXT3264(auVar119);
              auVar119 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
              auVar222 = ZEXT3264(auVar119);
              auVar119 = vbroadcastss_avx512vl(ZEXT416(0x3f7ffffa));
              auVar223 = ZEXT3264(auVar119);
              auVar119 = vbroadcastss_avx512vl(ZEXT416(0x3f800003));
              auVar224 = ZEXT3264(auVar119);
              auVar119 = vbroadcastss_avx512vl(ZEXT416(0x34000000));
              auVar219 = ZEXT3264(auVar119);
              auVar119 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
              auVar218 = ZEXT3264(auVar119);
              auVar181 = ZEXT3264(local_2b60);
              in_ZMM11 = ZEXT3264(local_2b40);
              in_ZMM13 = ZEXT3264(local_2aa0);
            }
            else {
              p_Var8 = context->args->filter;
              if (p_Var8 == (RTCFilterFunctionN)0x0) {
                auVar119 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                auVar220 = ZEXT3264(auVar119);
                auVar119 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                auVar221 = ZEXT3264(auVar119);
                auVar119 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
                auVar222 = ZEXT3264(auVar119);
                auVar119 = vbroadcastss_avx512vl(ZEXT416(0x3f7ffffa));
                auVar223 = ZEXT3264(auVar119);
                auVar119 = vbroadcastss_avx512vl(ZEXT416(0x3f800003));
                auVar224 = ZEXT3264(auVar119);
                auVar119 = vbroadcastss_avx512vl(ZEXT416(0x34000000));
                auVar219 = ZEXT3264(auVar119);
                auVar119 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                auVar218 = ZEXT3264(auVar119);
                auVar181 = ZEXT3264(local_2b60);
                in_ZMM11 = ZEXT3264(local_2b40);
                in_ZMM13 = ZEXT3264(local_2aa0);
              }
              else {
                auVar119 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                auVar220 = ZEXT3264(auVar119);
                auVar119 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                auVar221 = ZEXT3264(auVar119);
                auVar119 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
                auVar222 = ZEXT3264(auVar119);
                auVar119 = vbroadcastss_avx512vl(ZEXT416(0x3f7ffffa));
                auVar223 = ZEXT3264(auVar119);
                auVar119 = vbroadcastss_avx512vl(ZEXT416(0x3f800003));
                auVar224 = ZEXT3264(auVar119);
                auVar119 = vbroadcastss_avx512vl(ZEXT416(0x34000000));
                auVar219 = ZEXT3264(auVar119);
                auVar119 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                auVar218 = ZEXT3264(auVar119);
                auVar181 = ZEXT3264(local_2b60);
                in_ZMM11 = ZEXT3264(local_2b40);
                in_ZMM13 = ZEXT3264(local_2aa0);
                if (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                     RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                   (((local_2b18->field_8).field_0x2 & 0x40) != 0)) {
                  in_ZMM7 = ZEXT1664(in_ZMM7._0_16_);
                  in_ZMM10 = ZEXT1664(in_ZMM10._0_16_);
                  in_ZMM12 = ZEXT1664(in_ZMM12._0_16_);
                  in_ZMM14 = ZEXT1664(in_ZMM14._0_16_);
                  in_ZMM15 = ZEXT1664(in_ZMM15._0_16_);
                  (*p_Var8)(&local_2bc0);
                  in_ZMM13 = ZEXT3264(local_2aa0);
                  in_ZMM11 = ZEXT3264(local_2b40);
                  auVar181 = ZEXT3264(local_2b60);
                  auVar119 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                  auVar218 = ZEXT3264(auVar119);
                  auVar119 = vbroadcastss_avx512vl(ZEXT416(0x34000000));
                  auVar219 = ZEXT3264(auVar119);
                  auVar119 = vbroadcastss_avx512vl(ZEXT416(0x3f800003));
                  auVar224 = ZEXT3264(auVar119);
                  auVar119 = vbroadcastss_avx512vl(ZEXT416(0x3f7ffffa));
                  auVar223 = ZEXT3264(auVar119);
                  auVar119 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
                  auVar222 = ZEXT3264(auVar119);
                  auVar119 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                  auVar221 = ZEXT3264(auVar119);
                  auVar119 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                  auVar220 = ZEXT3264(auVar119);
                }
              }
              uVar105 = vptestmd_avx512vl(local_2a80,local_2a80);
              auVar119 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
              bVar102 = (bool)((byte)uVar105 & 1);
              auVar152._0_4_ =
                   (uint)bVar102 * auVar119._0_4_ |
                   (uint)!bVar102 * *(int *)&local_2bc0.ray[0x100].field_0x0;
              bVar102 = (bool)((byte)(uVar105 >> 1) & 1);
              auVar152._4_4_ =
                   (uint)bVar102 * auVar119._4_4_ |
                   (uint)!bVar102 * *(int *)(local_2bc0.ray + 0x104);
              bVar102 = (bool)((byte)(uVar105 >> 2) & 1);
              auVar152._8_4_ =
                   (uint)bVar102 * auVar119._8_4_ |
                   (uint)!bVar102 * *(int *)(local_2bc0.ray + 0x108);
              bVar102 = (bool)((byte)(uVar105 >> 3) & 1);
              auVar152._12_4_ =
                   (uint)bVar102 * auVar119._12_4_ |
                   (uint)!bVar102 * *(int *)(local_2bc0.ray + 0x10c);
              bVar102 = (bool)((byte)(uVar105 >> 4) & 1);
              auVar152._16_4_ =
                   (uint)bVar102 * auVar119._16_4_ |
                   (uint)!bVar102 * *(int *)(local_2bc0.ray + 0x110);
              bVar102 = (bool)((byte)(uVar105 >> 5) & 1);
              auVar152._20_4_ =
                   (uint)bVar102 * auVar119._20_4_ |
                   (uint)!bVar102 * *(int *)(local_2bc0.ray + 0x114);
              bVar102 = (bool)((byte)(uVar105 >> 6) & 1);
              auVar152._24_4_ =
                   (uint)bVar102 * auVar119._24_4_ |
                   (uint)!bVar102 * *(int *)(local_2bc0.ray + 0x118);
              bVar102 = SUB81(uVar105 >> 7,0);
              auVar152._28_4_ =
                   (uint)bVar102 * auVar119._28_4_ |
                   (uint)!bVar102 * *(int *)(local_2bc0.ray + 0x11c);
              *(undefined1 (*) [32])(local_2bc0.ray + 0x100) = auVar152;
            }
            bVar114 = (byte)uVar105;
            auVar153._0_4_ =
                 (uint)(bVar114 & 1) * *(int *)local_2b70 |
                 (uint)!(bool)(bVar114 & 1) * local_2920._0_4_;
            bVar102 = (bool)((byte)(uVar105 >> 1) & 1);
            auVar153._4_4_ =
                 (uint)bVar102 * *(int *)(local_2b70 + 4) | (uint)!bVar102 * local_2920._4_4_;
            bVar102 = (bool)((byte)(uVar105 >> 2) & 1);
            auVar153._8_4_ =
                 (uint)bVar102 * *(int *)(local_2b70 + 8) | (uint)!bVar102 * local_2920._8_4_;
            bVar102 = (bool)((byte)(uVar105 >> 3) & 1);
            auVar153._12_4_ =
                 (uint)bVar102 * *(int *)(local_2b70 + 0xc) | (uint)!bVar102 * local_2920._12_4_;
            bVar102 = (bool)((byte)(uVar105 >> 4) & 1);
            auVar153._16_4_ =
                 (uint)bVar102 * *(int *)(local_2b70 + 0x10) | (uint)!bVar102 * local_2920._16_4_;
            bVar102 = (bool)((byte)(uVar105 >> 5) & 1);
            auVar153._20_4_ =
                 (uint)bVar102 * *(int *)(local_2b70 + 0x14) | (uint)!bVar102 * local_2920._20_4_;
            bVar102 = (bool)((byte)(uVar105 >> 6) & 1);
            auVar153._24_4_ =
                 (uint)bVar102 * *(int *)(local_2b70 + 0x18) | (uint)!bVar102 * local_2920._24_4_;
            bVar102 = (bool)((byte)(uVar105 >> 7) & 1);
            auVar153._28_4_ =
                 (uint)bVar102 * *(int *)(local_2b70 + 0x1c) | (uint)!bVar102 * local_2920._28_4_;
            *(undefined1 (*) [32])local_2b70 = auVar153;
            uVar105 = local_2bd0 & 0xffffffff;
          }
          uVar105 = CONCAT71((int7)(uVar105 >> 8),(byte)uVar105 & ~bVar114);
        }
      }
      if ((byte)uVar105 == 0) {
        uVar105 = 0;
        goto LAB_01d0c90c;
      }
      auVar119 = *(undefined1 (*) [32])ray;
      auVar120 = *(undefined1 (*) [32])(ray + 0x20);
      auVar121 = *(undefined1 (*) [32])(ray + 0x40);
      auVar122 = *(undefined1 (*) [32])(ray + 0x80);
      in_ZMM7 = ZEXT3264(auVar122);
      auVar123 = *(undefined1 (*) [32])(ray + 0xa0);
      auVar124 = *(undefined1 (*) [32])(ray + 0xc0);
      in_ZMM10 = ZEXT3264(auVar124);
      auVar125 = vsubps_avx(_local_28a0,auVar119);
      auVar126 = vsubps_avx(_local_2860,auVar120);
      auVar130 = vsubps_avx(_local_2880,auVar121);
      auVar128 = vsubps_avx(auVar181._0_32_,auVar119);
      auVar129 = vsubps_avx(in_ZMM11._0_32_,auVar120);
      auVar146 = vsubps_avx512vl(in_ZMM13._0_32_,auVar121);
      auVar119 = vsubps_avx512vl(local_2660,auVar119);
      auVar120 = vsubps_avx512vl(local_2640,auVar120);
      auVar121 = vsubps_avx512vl(local_2680,auVar121);
      auVar131 = vsubps_avx512vl(auVar119,auVar125);
      in_ZMM11 = ZEXT3264(auVar131);
      auVar132 = vsubps_avx512vl(auVar120,auVar126);
      in_ZMM14 = ZEXT3264(auVar132);
      auVar133 = vsubps_avx512vl(auVar121,auVar130);
      in_ZMM13 = ZEXT3264(auVar133);
      auVar134 = vsubps_avx512vl(auVar125,auVar128);
      auVar135 = vsubps_avx512vl(auVar126,auVar129);
      auVar136 = vsubps_avx512vl(auVar130,auVar146);
      auVar137 = vsubps_avx512vl(auVar128,auVar119);
      auVar138 = vsubps_avx512vl(auVar129,auVar120);
      auVar139 = vsubps_avx512vl(auVar146,auVar121);
      auVar140 = vaddps_avx512vl(auVar119,auVar125);
      auVar141 = vaddps_avx512vl(auVar120,auVar126);
      auVar142 = vaddps_avx512vl(auVar121,auVar130);
      auVar147 = vmulps_avx512vl(auVar141,auVar133);
      auVar147 = vfmsub231ps_avx512vl(auVar147,auVar132,auVar142);
      auVar142 = vmulps_avx512vl(auVar142,auVar131);
      auVar142 = vfmsub231ps_avx512vl(auVar142,auVar133,auVar140);
      auVar49._4_4_ = auVar132._4_4_ * auVar140._4_4_;
      auVar49._0_4_ = auVar132._0_4_ * auVar140._0_4_;
      auVar49._8_4_ = auVar132._8_4_ * auVar140._8_4_;
      auVar49._12_4_ = auVar132._12_4_ * auVar140._12_4_;
      auVar49._16_4_ = auVar132._16_4_ * auVar140._16_4_;
      auVar49._20_4_ = auVar132._20_4_ * auVar140._20_4_;
      auVar49._24_4_ = auVar132._24_4_ * auVar140._24_4_;
      auVar49._28_4_ = auVar140._28_4_;
      auVar117 = vfmsub231ps_fma(auVar49,auVar131,auVar141);
      fVar204 = auVar124._0_4_;
      auVar171._0_4_ = fVar204 * auVar117._0_4_;
      fVar192 = auVar124._4_4_;
      auVar171._4_4_ = fVar192 * auVar117._4_4_;
      fVar196 = auVar124._8_4_;
      auVar171._8_4_ = fVar196 * auVar117._8_4_;
      fVar197 = auVar124._12_4_;
      auVar171._12_4_ = fVar197 * auVar117._12_4_;
      fVar198 = auVar124._16_4_;
      auVar171._16_4_ = fVar198 * 0.0;
      fVar199 = auVar124._20_4_;
      auVar171._20_4_ = fVar199 * 0.0;
      fVar200 = auVar124._24_4_;
      auVar171._24_4_ = fVar200 * 0.0;
      auVar171._28_4_ = 0;
      auVar140 = vfmadd231ps_avx512vl(auVar171,auVar123,auVar142);
      auVar140 = vfmadd231ps_avx512vl(auVar140,auVar122,auVar147);
      auVar180._0_4_ = auVar128._0_4_ + auVar125._0_4_;
      auVar180._4_4_ = auVar128._4_4_ + auVar125._4_4_;
      auVar180._8_4_ = auVar128._8_4_ + auVar125._8_4_;
      auVar180._12_4_ = auVar128._12_4_ + auVar125._12_4_;
      auVar180._16_4_ = auVar128._16_4_ + auVar125._16_4_;
      auVar180._20_4_ = auVar128._20_4_ + auVar125._20_4_;
      auVar180._24_4_ = auVar128._24_4_ + auVar125._24_4_;
      auVar180._28_4_ = auVar128._28_4_ + auVar125._28_4_;
      auVar141 = vaddps_avx512vl(auVar126,auVar129);
      auVar142 = vaddps_avx512vl(auVar130,auVar146);
      auVar147 = vmulps_avx512vl(auVar141,auVar136);
      auVar147 = vfmsub231ps_avx512vl(auVar147,auVar135,auVar142);
      auVar142 = vmulps_avx512vl(auVar142,auVar134);
      auVar142 = vfmsub231ps_avx512vl(auVar142,auVar136,auVar180);
      auVar148 = vmulps_avx512vl(auVar180,auVar135);
      auVar141 = vfmsub231ps_avx512vl(auVar148,auVar134,auVar141);
      auVar50._4_4_ = fVar192 * auVar141._4_4_;
      auVar50._0_4_ = fVar204 * auVar141._0_4_;
      auVar50._8_4_ = fVar196 * auVar141._8_4_;
      auVar50._12_4_ = fVar197 * auVar141._12_4_;
      auVar50._16_4_ = fVar198 * auVar141._16_4_;
      auVar50._20_4_ = fVar199 * auVar141._20_4_;
      auVar50._24_4_ = fVar200 * auVar141._24_4_;
      auVar50._28_4_ = auVar141._28_4_;
      auVar141 = vfmadd231ps_avx512vl(auVar50,auVar123,auVar142);
      auVar142 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
      auVar218 = ZEXT3264(auVar142);
      auVar141 = vfmadd231ps_avx512vl(auVar141,auVar122,auVar147);
      auVar181 = ZEXT3264(auVar141);
      auVar147 = vbroadcastss_avx512vl(ZEXT416(0x34000000));
      auVar219 = ZEXT3264(auVar147);
      auVar119 = vaddps_avx512vl(auVar128,auVar119);
      auVar120 = vaddps_avx512vl(auVar129,auVar120);
      auVar121 = vaddps_avx512vl(auVar146,auVar121);
      auVar128 = vmulps_avx512vl(auVar120,auVar139);
      auVar128 = vfmsub231ps_avx512vl(auVar128,auVar138,auVar121);
      auVar121 = vmulps_avx512vl(auVar121,auVar137);
      auVar121 = vfmsub231ps_avx512vl(auVar121,auVar139,auVar119);
      auVar51._4_4_ = auVar119._4_4_ * auVar138._4_4_;
      auVar51._0_4_ = auVar119._0_4_ * auVar138._0_4_;
      auVar51._8_4_ = auVar119._8_4_ * auVar138._8_4_;
      auVar51._12_4_ = auVar119._12_4_ * auVar138._12_4_;
      auVar51._16_4_ = auVar119._16_4_ * auVar138._16_4_;
      auVar51._20_4_ = auVar119._20_4_ * auVar138._20_4_;
      auVar51._24_4_ = auVar119._24_4_ * auVar138._24_4_;
      auVar51._28_4_ = auVar119._28_4_;
      auVar117 = vfmsub231ps_fma(auVar51,auVar137,auVar120);
      auVar119 = vmulps_avx512vl(ZEXT1632(auVar117),auVar124);
      auVar119 = vfmadd231ps_avx512vl(auVar119,auVar123,auVar121);
      auVar119 = vfmadd231ps_avx512vl(auVar119,auVar122,auVar128);
      auVar214._0_4_ = auVar140._0_4_ + auVar141._0_4_;
      auVar214._4_4_ = auVar140._4_4_ + auVar141._4_4_;
      auVar214._8_4_ = auVar140._8_4_ + auVar141._8_4_;
      auVar214._12_4_ = auVar140._12_4_ + auVar141._12_4_;
      auVar214._16_4_ = auVar140._16_4_ + auVar141._16_4_;
      auVar214._20_4_ = auVar140._20_4_ + auVar141._20_4_;
      auVar214._24_4_ = auVar140._24_4_ + auVar141._24_4_;
      auVar214._28_4_ = auVar140._28_4_ + auVar141._28_4_;
      auVar120 = vaddps_avx512vl(auVar119,auVar214);
      in_ZMM12 = ZEXT3264(auVar120);
      auVar146 = auVar220._0_32_;
      vandps_avx512vl(auVar120,auVar146);
      in_ZMM15 = ZEXT3264(auVar120);
      auVar121 = vmulps_avx512vl(auVar120,auVar147);
      auVar128 = vminps_avx512vl(auVar140,auVar141);
      auVar128 = vminps_avx512vl(auVar128,auVar119);
      auVar129 = vxorps_avx512vl(auVar121,auVar142);
      uVar18 = vcmpps_avx512vl(auVar128,auVar129,5);
      auVar128 = vmaxps_avx512vl(auVar140,auVar141);
      auVar119 = vmaxps_avx512vl(auVar128,auVar119);
      uVar19 = vcmpps_avx512vl(auVar119,auVar121,2);
      bVar114 = ((byte)uVar18 | (byte)uVar19) & (byte)uVar105;
      if (bVar114 != 0) {
        auVar119 = vmulps_avx512vl(auVar135,auVar133);
        auVar121 = vmulps_avx512vl(auVar131,auVar136);
        auVar128 = vmulps_avx512vl(auVar134,auVar132);
        auVar129 = vmulps_avx512vl(auVar138,auVar136);
        auVar142 = vmulps_avx512vl(auVar134,auVar139);
        auVar147 = vmulps_avx512vl(auVar137,auVar135);
        auVar132 = vfmsub213ps_avx512vl(auVar132,auVar136,auVar119);
        in_ZMM14 = ZEXT3264(auVar132);
        auVar133 = vfmsub213ps_avx512vl(auVar133,auVar134,auVar121);
        in_ZMM13 = ZEXT3264(auVar133);
        auVar131 = vfmsub213ps_avx512vl(auVar131,auVar135,auVar128);
        in_ZMM11 = ZEXT3264(auVar131);
        auVar135 = vfmsub213ps_avx512vl(auVar139,auVar135,auVar129);
        auVar136 = vfmsub213ps_avx512vl(auVar137,auVar136,auVar142);
        auVar134 = vfmsub213ps_avx512vl(auVar138,auVar134,auVar147);
        vandps_avx512vl(auVar119,auVar146);
        vandps_avx512vl(auVar129,auVar146);
        uVar104 = vcmpps_avx512vl(auVar134,auVar134,1);
        vandps_avx512vl(auVar121,auVar146);
        vandps_avx512vl(auVar142,auVar146);
        uVar116 = vcmpps_avx512vl(auVar134,auVar134,1);
        vandps_avx512vl(auVar128,auVar146);
        vandps_avx512vl(auVar147,auVar146);
        auVar119 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
        auVar218 = ZEXT3264(auVar119);
        uVar110 = vcmpps_avx512vl(auVar134,auVar134,1);
        bVar102 = (bool)((byte)uVar104 & 1);
        vVar149.field_0._0_4_ = (uint)bVar102 * auVar132._0_4_ | (uint)!bVar102 * auVar135._0_4_;
        bVar102 = (bool)((byte)(uVar104 >> 1) & 1);
        vVar149.field_0._4_4_ = (uint)bVar102 * auVar132._4_4_ | (uint)!bVar102 * auVar135._4_4_;
        bVar102 = (bool)((byte)(uVar104 >> 2) & 1);
        vVar149.field_0._8_4_ = (uint)bVar102 * auVar132._8_4_ | (uint)!bVar102 * auVar135._8_4_;
        bVar102 = (bool)((byte)(uVar104 >> 3) & 1);
        vVar149.field_0._12_4_ = (uint)bVar102 * auVar132._12_4_ | (uint)!bVar102 * auVar135._12_4_;
        bVar102 = (bool)((byte)(uVar104 >> 4) & 1);
        vVar149.field_0._16_4_ = (uint)bVar102 * auVar132._16_4_ | (uint)!bVar102 * auVar135._16_4_;
        bVar102 = (bool)((byte)(uVar104 >> 5) & 1);
        vVar149.field_0._20_4_ = (uint)bVar102 * auVar132._20_4_ | (uint)!bVar102 * auVar135._20_4_;
        bVar102 = (bool)((byte)(uVar104 >> 6) & 1);
        vVar149.field_0._24_4_ = (uint)bVar102 * auVar132._24_4_ | (uint)!bVar102 * auVar135._24_4_;
        bVar102 = SUB81(uVar104 >> 7,0);
        vVar149.field_0._28_4_ = (uint)bVar102 * auVar132._28_4_ | (uint)!bVar102 * auVar135._28_4_;
        bVar102 = (bool)((byte)uVar116 & 1);
        vVar150.field_0._0_4_ = (uint)bVar102 * auVar133._0_4_ | (uint)!bVar102 * auVar136._0_4_;
        bVar102 = (bool)((byte)(uVar116 >> 1) & 1);
        vVar150.field_0._4_4_ = (uint)bVar102 * auVar133._4_4_ | (uint)!bVar102 * auVar136._4_4_;
        bVar102 = (bool)((byte)(uVar116 >> 2) & 1);
        vVar150.field_0._8_4_ = (uint)bVar102 * auVar133._8_4_ | (uint)!bVar102 * auVar136._8_4_;
        bVar102 = (bool)((byte)(uVar116 >> 3) & 1);
        vVar150.field_0._12_4_ = (uint)bVar102 * auVar133._12_4_ | (uint)!bVar102 * auVar136._12_4_;
        bVar102 = (bool)((byte)(uVar116 >> 4) & 1);
        vVar150.field_0._16_4_ = (uint)bVar102 * auVar133._16_4_ | (uint)!bVar102 * auVar136._16_4_;
        bVar102 = (bool)((byte)(uVar116 >> 5) & 1);
        vVar150.field_0._20_4_ = (uint)bVar102 * auVar133._20_4_ | (uint)!bVar102 * auVar136._20_4_;
        bVar102 = (bool)((byte)(uVar116 >> 6) & 1);
        vVar150.field_0._24_4_ = (uint)bVar102 * auVar133._24_4_ | (uint)!bVar102 * auVar136._24_4_;
        bVar102 = SUB81(uVar116 >> 7,0);
        vVar150.field_0._28_4_ = (uint)bVar102 * auVar133._28_4_ | (uint)!bVar102 * auVar136._28_4_;
        bVar102 = (bool)((byte)uVar110 & 1);
        vVar151.field_0._0_4_ =
             (float)((uint)bVar102 * auVar131._0_4_ | (uint)!bVar102 * auVar134._0_4_);
        bVar102 = (bool)((byte)(uVar110 >> 1) & 1);
        vVar151.field_0._4_4_ =
             (float)((uint)bVar102 * auVar131._4_4_ | (uint)!bVar102 * auVar134._4_4_);
        bVar102 = (bool)((byte)(uVar110 >> 2) & 1);
        vVar151.field_0._8_4_ =
             (float)((uint)bVar102 * auVar131._8_4_ | (uint)!bVar102 * auVar134._8_4_);
        bVar102 = (bool)((byte)(uVar110 >> 3) & 1);
        vVar151.field_0._12_4_ =
             (float)((uint)bVar102 * auVar131._12_4_ | (uint)!bVar102 * auVar134._12_4_);
        bVar102 = (bool)((byte)(uVar110 >> 4) & 1);
        vVar151.field_0._16_4_ =
             (float)((uint)bVar102 * auVar131._16_4_ | (uint)!bVar102 * auVar134._16_4_);
        bVar102 = (bool)((byte)(uVar110 >> 5) & 1);
        vVar151.field_0._20_4_ =
             (float)((uint)bVar102 * auVar131._20_4_ | (uint)!bVar102 * auVar134._20_4_);
        bVar102 = (bool)((byte)(uVar110 >> 6) & 1);
        vVar151.field_0._24_4_ =
             (float)((uint)bVar102 * auVar131._24_4_ | (uint)!bVar102 * auVar134._24_4_);
        bVar102 = SUB81(uVar110 >> 7,0);
        vVar151.field_0._28_4_ = (uint)bVar102 * auVar131._28_4_ | (uint)!bVar102 * auVar134._28_4_;
        auVar205._0_4_ = fVar204 * vVar151.field_0._0_4_;
        auVar205._4_4_ = fVar192 * vVar151.field_0._4_4_;
        auVar205._8_4_ = fVar196 * vVar151.field_0._8_4_;
        auVar205._12_4_ = fVar197 * vVar151.field_0._12_4_;
        auVar52._16_4_ = fVar198 * vVar151.field_0._16_4_;
        auVar52._0_16_ = auVar205;
        auVar52._20_4_ = fVar199 * vVar151.field_0._20_4_;
        auVar52._24_4_ = fVar200 * vVar151.field_0._24_4_;
        auVar52._28_4_ = auVar124._28_4_;
        in_ZMM10 = ZEXT3264(auVar52);
        auVar117 = vfmadd213ps_fma(auVar123,(undefined1  [32])vVar150.field_0,auVar52);
        auVar117 = vfmadd213ps_fma(auVar122,(undefined1  [32])vVar149.field_0,ZEXT1632(auVar117));
        auVar193._0_4_ = auVar117._0_4_ + auVar117._0_4_;
        auVar193._4_4_ = auVar117._4_4_ + auVar117._4_4_;
        auVar193._8_4_ = auVar117._8_4_ + auVar117._8_4_;
        auVar193._12_4_ = auVar117._12_4_ + auVar117._12_4_;
        auVar123 = ZEXT1632(auVar193);
        in_ZMM7 = ZEXT3264(auVar123);
        auVar203._0_4_ = auVar130._0_4_ * vVar151.field_0._0_4_;
        auVar203._4_4_ = auVar130._4_4_ * vVar151.field_0._4_4_;
        auVar203._8_4_ = auVar130._8_4_ * vVar151.field_0._8_4_;
        auVar203._12_4_ = auVar130._12_4_ * vVar151.field_0._12_4_;
        auVar203._16_4_ = auVar130._16_4_ * vVar151.field_0._16_4_;
        auVar203._20_4_ = auVar130._20_4_ * vVar151.field_0._20_4_;
        auVar203._24_4_ = auVar130._24_4_ * vVar151.field_0._24_4_;
        auVar203._28_4_ = 0;
        auVar117 = vfmadd213ps_fma(auVar126,(undefined1  [32])vVar150.field_0,auVar203);
        auVar157 = vfmadd213ps_fma(auVar125,(undefined1  [32])vVar149.field_0,ZEXT1632(auVar117));
        auVar121 = vrcp14ps_avx512vl(auVar123);
        auVar119 = vxorps_avx512vl(auVar123,auVar119);
        auVar124 = auVar221._0_32_;
        auVar122 = vfnmadd213ps_avx512vl(auVar121,auVar123,auVar124);
        auVar117 = vfmadd132ps_fma(auVar122,auVar121,auVar121);
        local_29e0 = ZEXT1632(CONCAT412(auVar117._12_4_ * (auVar157._12_4_ + auVar157._12_4_),
                                        CONCAT48(auVar117._8_4_ * (auVar157._8_4_ + auVar157._8_4_),
                                                 CONCAT44(auVar117._4_4_ *
                                                          (auVar157._4_4_ + auVar157._4_4_),
                                                          auVar117._0_4_ *
                                                          (auVar157._0_4_ + auVar157._0_4_)))));
        uVar18 = vcmpps_avx512vl(local_29e0,*(undefined1 (*) [32])(ray + 0x100),2);
        uVar19 = vcmpps_avx512vl(local_29e0,*(undefined1 (*) [32])(ray + 0x60),0xd);
        uVar20 = vcmpps_avx512vl(auVar123,auVar119,4);
        bVar114 = bVar114 & (byte)uVar18 & (byte)uVar19 & (byte)uVar20;
        if (bVar114 != 0) {
          uVar104 = CONCAT44(0,*(uint *)(lVar109 + 0x40 + lVar111 * 4));
          pGVar6 = (context->scene->geometries).items[uVar104].ptr;
          uVar113 = pGVar6->mask;
          auVar191._4_4_ = uVar113;
          auVar191._0_4_ = uVar113;
          auVar191._8_4_ = uVar113;
          auVar191._12_4_ = uVar113;
          auVar191._16_4_ = uVar113;
          auVar191._20_4_ = uVar113;
          auVar191._24_4_ = uVar113;
          auVar191._28_4_ = uVar113;
          uVar18 = vptestmd_avx512vl(auVar191,*(undefined1 (*) [32])(ray + 0x120));
          bVar114 = bVar114 & (byte)uVar18;
          if (bVar114 != 0) {
            local_2b60._0_4_ = *(undefined4 *)(lVar109 + 0x50 + lVar111 * 4);
            if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
               (pGVar6->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
              local_2bd0 = CONCAT44(local_2bd0._4_4_,(int)uVar105);
              auVar39._8_4_ = 0x219392ef;
              auVar39._0_8_ = 0x219392ef219392ef;
              auVar39._12_4_ = 0x219392ef;
              auVar39._16_4_ = 0x219392ef;
              auVar39._20_4_ = 0x219392ef;
              auVar39._24_4_ = 0x219392ef;
              auVar39._28_4_ = 0x219392ef;
              uVar105 = vcmpps_avx512vl(auVar120,auVar39,5);
              auVar119 = vrcp14ps_avx512vl(auVar120);
              auVar121 = vfnmadd213ps_avx512vl(auVar120,auVar119,auVar124);
              auVar119 = vfmadd132ps_avx512vl(auVar121,auVar119,auVar119);
              fVar200 = (float)((uint)((byte)uVar105 & 1) * auVar119._0_4_);
              fVar199 = (float)((uint)((byte)(uVar105 >> 1) & 1) * auVar119._4_4_);
              fVar198 = (float)((uint)((byte)(uVar105 >> 2) & 1) * auVar119._8_4_);
              fVar197 = (float)((uint)((byte)(uVar105 >> 3) & 1) * auVar119._12_4_);
              fVar196 = (float)((uint)((byte)(uVar105 >> 4) & 1) * auVar119._16_4_);
              fVar192 = (float)((uint)((byte)(uVar105 >> 5) & 1) * auVar119._20_4_);
              fVar204 = (float)((uint)((byte)(uVar105 >> 6) & 1) * auVar119._24_4_);
              auVar54._4_4_ = fVar199 * auVar140._4_4_;
              auVar54._0_4_ = fVar200 * auVar140._0_4_;
              auVar54._8_4_ = fVar198 * auVar140._8_4_;
              auVar54._12_4_ = fVar197 * auVar140._12_4_;
              auVar54._16_4_ = fVar196 * auVar140._16_4_;
              auVar54._20_4_ = fVar192 * auVar140._20_4_;
              auVar54._24_4_ = fVar204 * auVar140._24_4_;
              auVar54._28_4_ = auVar140._28_4_;
              auVar119 = vminps_avx512vl(auVar54,auVar124);
              auVar55._4_4_ = fVar199 * auVar141._4_4_;
              auVar55._0_4_ = fVar200 * auVar141._0_4_;
              auVar55._8_4_ = fVar198 * auVar141._8_4_;
              auVar55._12_4_ = fVar197 * auVar141._12_4_;
              auVar55._16_4_ = fVar196 * auVar141._16_4_;
              auVar55._20_4_ = fVar192 * auVar141._20_4_;
              auVar55._24_4_ = fVar204 * auVar141._24_4_;
              auVar55._28_4_ = auVar141._28_4_;
              auVar121 = vminps_avx512vl(auVar55,auVar124);
              local_29a0 = vsubps_avx512vl(auVar124,auVar119);
              local_29c0 = vsubps_avx512vl(auVar124,auVar121);
              local_2bc0.geometryUserPtr = local_2900;
              local_2bc0.valid = (int *)local_2b00;
              local_2bc0.context = (RTCRayQueryContext *)local_28e0;
              local_2bc0.ray = (RTCRayN *)local_28c0;
              local_2b40._0_8_ = pGVar6;
              local_2aa0._0_8_ = uVar104;
              in_ZMM7 = ZEXT1664(auVar193);
              in_ZMM10 = ZEXT1664(auVar205);
              in_ZMM11 = ZEXT1664(auVar131._0_16_);
              in_ZMM12 = ZEXT1664(CONCAT412(fVar197,CONCAT48(fVar198,CONCAT44(fVar199,fVar200))));
              in_ZMM13 = ZEXT1664(auVar133._0_16_);
              in_ZMM14 = ZEXT1664(auVar132._0_16_);
              in_ZMM15 = ZEXT1664(auVar120._0_16_);
              local_2a40.field_0.x.field_0 = (vfloat_impl<8>)(undefined1  [32])vVar149.field_0;
              local_2a40.field_0.y.field_0 = (vfloat_impl<8>)(undefined1  [32])vVar150.field_0;
              local_2a40.field_0.z.field_0 = (vfloat_impl<8>)(undefined1  [32])vVar151.field_0;
              std::
              _Tuple_impl<0ul,embree::vfloat_impl<8>&,embree::vfloat_impl<8>&,embree::vfloat_impl<8>&,embree::Vec3<embree::vfloat_impl<8>>&>
              ::
              _M_assign<embree::vfloat_impl<8>,embree::vfloat_impl<8>,embree::vfloat_impl<8>,embree::Vec3<embree::vfloat_impl<8>>>
                        ((_Tuple_impl<0UL,_embree::vfloat_impl<8>_&,_embree::vfloat_impl<8>_&,_embree::vfloat_impl<8>_&,_embree::Vec3<embree::vfloat_impl<8>_>_&>
                          *)&local_2bc0,
                         (_Tuple_impl<0UL,_embree::vfloat_impl<8>,_embree::vfloat_impl<8>,_embree::vfloat_impl<8>,_embree::Vec3<embree::vfloat_impl<8>_>_>
                          *)&local_2a40.field_0);
              pRVar7 = context->user;
              local_2980 = vpbroadcastd_avx512vl();
              local_29a0 = vpbroadcastd_avx512vl();
              local_2a40._4_4_ = local_2b00[1];
              local_2a40._0_4_ = local_2b00[0];
              local_2a40._12_4_ = local_2b00[3];
              local_2a40._8_4_ = local_2b00[2];
              local_2a40._20_4_ = fStack_2aec;
              local_2a40._16_4_ = fStack_2af0;
              local_2a40._28_4_ = uStack_2ae4;
              local_2a40._24_4_ = fStack_2ae8;
              local_2a40._36_4_ = local_2ae0[1];
              local_2a40._32_4_ = local_2ae0[0];
              local_2a40._40_4_ = local_2ae0[2];
              local_2a40._44_4_ = local_2ae0[3];
              local_2a40._48_4_ = fStack_2ad0;
              local_2a40._52_4_ = fStack_2acc;
              local_2a40._56_4_ = fStack_2ac8;
              local_2a40._60_4_ = uStack_2ac4;
              auVar117._4_4_ = local_2ac0[1];
              auVar117._0_4_ = local_2ac0[0];
              auVar117._8_4_ = local_2ac0[2];
              auVar117._12_4_ = local_2ac0[3];
              local_2a40._80_4_ = fStack_2ab0;
              local_2a40._64_16_ = auVar117;
              local_2a40._84_4_ = fStack_2aac;
              local_2a40._88_4_ = fStack_2aa8;
              local_2a40._92_4_ = uStack_2aa4;
              auVar181 = ZEXT3264((undefined1  [32])local_2a40.field_0.z.field_0);
              local_29c0 = local_28e0;
              auVar119 = vpcmpeqd_avx2(local_2980,local_2980);
              local_2b10[1] = auVar119;
              *local_2b10 = auVar119;
              local_2960 = pRVar7->instID[0];
              uStack_295c = local_2960;
              uStack_2958 = local_2960;
              uStack_2954 = local_2960;
              uStack_2950 = local_2960;
              uStack_294c = local_2960;
              uStack_2948 = local_2960;
              uStack_2944 = local_2960;
              local_2940 = pRVar7->instPrimID[0];
              uStack_293c = local_2940;
              uStack_2938 = local_2940;
              uStack_2934 = local_2940;
              uStack_2930 = local_2940;
              uStack_292c = local_2940;
              uStack_2928 = local_2940;
              uStack_2924 = local_2940;
              local_2b60 = *(undefined1 (*) [32])(ray + 0x100);
              auVar119 = vblendmps_avx512vl(local_2b60,local_2900);
              bVar102 = (bool)(bVar114 >> 1 & 1);
              bVar9 = (bool)(bVar114 >> 2 & 1);
              bVar10 = (bool)(bVar114 >> 3 & 1);
              bVar11 = (bool)(bVar114 >> 4 & 1);
              bVar12 = (bool)(bVar114 >> 5 & 1);
              bVar13 = (bool)(bVar114 >> 6 & 1);
              *(uint *)(ray + 0x100) =
                   (uint)(bVar114 & 1) * auVar119._0_4_ | !(bool)(bVar114 & 1) * local_2940;
              *(uint *)(ray + 0x104) = (uint)bVar102 * auVar119._4_4_ | !bVar102 * local_2940;
              *(uint *)(ray + 0x108) = (uint)bVar9 * auVar119._8_4_ | !bVar9 * local_2940;
              *(uint *)(ray + 0x10c) = (uint)bVar10 * auVar119._12_4_ | !bVar10 * local_2940;
              *(uint *)(ray + 0x110) = (uint)bVar11 * auVar119._16_4_ | !bVar11 * local_2940;
              *(uint *)(ray + 0x114) = (uint)bVar12 * auVar119._20_4_ | !bVar12 * local_2940;
              *(uint *)(ray + 0x118) = (uint)bVar13 * auVar119._24_4_ | !bVar13 * local_2940;
              *(uint *)(ray + 0x11c) =
                   (uint)(bVar114 >> 7) * auVar119._28_4_ | !(bool)(bVar114 >> 7) * local_2940;
              local_2a80 = vpmovm2d_avx512vl((ulong)bVar114);
              local_2bc0.geometryUserPtr = (void *)*(undefined8 *)(local_2b40._0_8_ + 0x18);
              local_2bc0.valid = (int *)local_2a80;
              local_2bc0.context = context->user;
              local_2bc0.ray = (RTCRayN *)ray;
              local_2bc0.hit = (RTCHitN *)&local_2a40;
              local_2bc0.N = 8;
              if (*(code **)(local_2b40._0_8_ + 0x48) != (code *)0x0) {
                auVar181 = ZEXT1664(auVar117);
                in_ZMM7 = ZEXT1664(in_ZMM7._0_16_);
                in_ZMM10 = ZEXT1664(in_ZMM10._0_16_);
                in_ZMM11 = ZEXT1664(in_ZMM11._0_16_);
                in_ZMM12 = ZEXT1664(in_ZMM12._0_16_);
                in_ZMM13 = ZEXT1664(in_ZMM13._0_16_);
                in_ZMM14 = ZEXT1664(in_ZMM14._0_16_);
                in_ZMM15 = ZEXT1664(in_ZMM15._0_16_);
                (**(code **)(local_2b40._0_8_ + 0x48))(&local_2bc0);
              }
              if (local_2a80 == (undefined1  [32])0x0) {
                uVar105 = 0;
                auVar119 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                auVar220 = ZEXT3264(auVar119);
                auVar119 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                auVar221 = ZEXT3264(auVar119);
                auVar119 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
                auVar222 = ZEXT3264(auVar119);
                auVar119 = vbroadcastss_avx512vl(ZEXT416(0x3f7ffffa));
                auVar223 = ZEXT3264(auVar119);
                auVar119 = vbroadcastss_avx512vl(ZEXT416(0x3f800003));
                auVar224 = ZEXT3264(auVar119);
                auVar119 = vbroadcastss_avx512vl(ZEXT416(0x34000000));
                auVar219 = ZEXT3264(auVar119);
                auVar119 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                auVar218 = ZEXT3264(auVar119);
              }
              else {
                p_Var8 = context->args->filter;
                if (p_Var8 == (RTCFilterFunctionN)0x0) {
                  auVar119 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                  auVar220 = ZEXT3264(auVar119);
                  auVar119 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                  auVar221 = ZEXT3264(auVar119);
                  auVar119 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
                  auVar222 = ZEXT3264(auVar119);
                  auVar119 = vbroadcastss_avx512vl(ZEXT416(0x3f7ffffa));
                  auVar223 = ZEXT3264(auVar119);
                  auVar119 = vbroadcastss_avx512vl(ZEXT416(0x3f800003));
                  auVar224 = ZEXT3264(auVar119);
                  auVar119 = vbroadcastss_avx512vl(ZEXT416(0x34000000));
                  auVar219 = ZEXT3264(auVar119);
                  auVar119 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                  auVar218 = ZEXT3264(auVar119);
                }
                else {
                  auVar119 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                  auVar220 = ZEXT3264(auVar119);
                  auVar119 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                  auVar221 = ZEXT3264(auVar119);
                  auVar119 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
                  auVar222 = ZEXT3264(auVar119);
                  auVar119 = vbroadcastss_avx512vl(ZEXT416(0x3f7ffffa));
                  auVar223 = ZEXT3264(auVar119);
                  auVar119 = vbroadcastss_avx512vl(ZEXT416(0x3f800003));
                  auVar224 = ZEXT3264(auVar119);
                  auVar119 = vbroadcastss_avx512vl(ZEXT416(0x34000000));
                  auVar219 = ZEXT3264(auVar119);
                  auVar119 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                  auVar218 = ZEXT3264(auVar119);
                  if (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                       RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                     ((*(byte *)(local_2b40._0_8_ + 0x3e) & 0x40) != 0)) {
                    auVar181 = ZEXT1664(auVar181._0_16_);
                    in_ZMM7 = ZEXT1664(in_ZMM7._0_16_);
                    in_ZMM10 = ZEXT1664(in_ZMM10._0_16_);
                    in_ZMM11 = ZEXT1664(in_ZMM11._0_16_);
                    in_ZMM12 = ZEXT1664(in_ZMM12._0_16_);
                    in_ZMM13 = ZEXT1664(in_ZMM13._0_16_);
                    in_ZMM14 = ZEXT1664(in_ZMM14._0_16_);
                    in_ZMM15 = ZEXT1664(in_ZMM15._0_16_);
                    (*p_Var8)(&local_2bc0);
                    auVar119 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                    auVar218 = ZEXT3264(auVar119);
                    auVar119 = vbroadcastss_avx512vl(ZEXT416(0x34000000));
                    auVar219 = ZEXT3264(auVar119);
                    auVar119 = vbroadcastss_avx512vl(ZEXT416(0x3f800003));
                    auVar224 = ZEXT3264(auVar119);
                    auVar119 = vbroadcastss_avx512vl(ZEXT416(0x3f7ffffa));
                    auVar223 = ZEXT3264(auVar119);
                    auVar119 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
                    auVar222 = ZEXT3264(auVar119);
                    auVar119 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                    auVar221 = ZEXT3264(auVar119);
                    auVar119 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                    auVar220 = ZEXT3264(auVar119);
                  }
                }
                uVar105 = vptestmd_avx512vl(local_2a80,local_2a80);
                auVar119 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                bVar102 = (bool)((byte)uVar105 & 1);
                auVar154._0_4_ =
                     (uint)bVar102 * auVar119._0_4_ |
                     (uint)!bVar102 * *(int *)&local_2bc0.ray[0x100].field_0x0;
                bVar102 = (bool)((byte)(uVar105 >> 1) & 1);
                auVar154._4_4_ =
                     (uint)bVar102 * auVar119._4_4_ |
                     (uint)!bVar102 * *(int *)(local_2bc0.ray + 0x104);
                bVar102 = (bool)((byte)(uVar105 >> 2) & 1);
                auVar154._8_4_ =
                     (uint)bVar102 * auVar119._8_4_ |
                     (uint)!bVar102 * *(int *)(local_2bc0.ray + 0x108);
                bVar102 = (bool)((byte)(uVar105 >> 3) & 1);
                auVar154._12_4_ =
                     (uint)bVar102 * auVar119._12_4_ |
                     (uint)!bVar102 * *(int *)(local_2bc0.ray + 0x10c);
                bVar102 = (bool)((byte)(uVar105 >> 4) & 1);
                auVar154._16_4_ =
                     (uint)bVar102 * auVar119._16_4_ |
                     (uint)!bVar102 * *(int *)(local_2bc0.ray + 0x110);
                bVar102 = (bool)((byte)(uVar105 >> 5) & 1);
                auVar154._20_4_ =
                     (uint)bVar102 * auVar119._20_4_ |
                     (uint)!bVar102 * *(int *)(local_2bc0.ray + 0x114);
                bVar102 = (bool)((byte)(uVar105 >> 6) & 1);
                auVar154._24_4_ =
                     (uint)bVar102 * auVar119._24_4_ |
                     (uint)!bVar102 * *(int *)(local_2bc0.ray + 0x118);
                bVar102 = SUB81(uVar105 >> 7,0);
                auVar154._28_4_ =
                     (uint)bVar102 * auVar119._28_4_ |
                     (uint)!bVar102 * *(int *)(local_2bc0.ray + 0x11c);
                *(undefined1 (*) [32])(local_2bc0.ray + 0x100) = auVar154;
              }
              bVar114 = (byte)uVar105;
              auVar155._0_4_ =
                   (uint)(bVar114 & 1) * *(int *)local_2b70 |
                   (uint)!(bool)(bVar114 & 1) * local_2b60._0_4_;
              bVar102 = (bool)((byte)(uVar105 >> 1) & 1);
              auVar155._4_4_ =
                   (uint)bVar102 * *(int *)(local_2b70 + 4) | (uint)!bVar102 * local_2b60._4_4_;
              bVar102 = (bool)((byte)(uVar105 >> 2) & 1);
              auVar155._8_4_ =
                   (uint)bVar102 * *(int *)(local_2b70 + 8) | (uint)!bVar102 * local_2b60._8_4_;
              bVar102 = (bool)((byte)(uVar105 >> 3) & 1);
              auVar155._12_4_ =
                   (uint)bVar102 * *(int *)(local_2b70 + 0xc) | (uint)!bVar102 * local_2b60._12_4_;
              bVar102 = (bool)((byte)(uVar105 >> 4) & 1);
              auVar155._16_4_ =
                   (uint)bVar102 * *(int *)(local_2b70 + 0x10) | (uint)!bVar102 * local_2b60._16_4_;
              bVar102 = (bool)((byte)(uVar105 >> 5) & 1);
              auVar155._20_4_ =
                   (uint)bVar102 * *(int *)(local_2b70 + 0x14) | (uint)!bVar102 * local_2b60._20_4_;
              bVar102 = (bool)((byte)(uVar105 >> 6) & 1);
              auVar155._24_4_ =
                   (uint)bVar102 * *(int *)(local_2b70 + 0x18) | (uint)!bVar102 * local_2b60._24_4_;
              bVar102 = (bool)((byte)(uVar105 >> 7) & 1);
              auVar155._28_4_ =
                   (uint)bVar102 * *(int *)(local_2b70 + 0x1c) | (uint)!bVar102 * local_2b60._28_4_;
              *(undefined1 (*) [32])local_2b70 = auVar155;
              uVar105 = local_2bd0 & 0xffffffff;
            }
            uVar105 = CONCAT71((int7)(uVar105 >> 8),(byte)uVar105 & ~bVar114);
          }
        }
      }
      lVar111 = lVar111 + 1;
    } while ((char)uVar105 != '\0');
    uVar105 = 0;
LAB_01d0c90c:
    lVar106 = local_2b08 + 1;
    bVar101 = bVar101 & (byte)uVar105;
  } while (bVar101 != 0);
  bVar101 = 0;
LAB_01d0c927:
  bVar101 = (byte)local_2c04 | ~bVar101;
  local_2c04 = (uint)bVar101;
  if (bVar101 == 0xff) {
    local_2c04 = 0xff;
    goto LAB_01d0ca8c;
  }
  auVar119 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
  bVar102 = (bool)(bVar101 >> 1 & 1);
  bVar9 = (bool)(bVar101 >> 2 & 1);
  bVar10 = (bool)(bVar101 >> 3 & 1);
  bVar11 = (bool)(bVar101 >> 4 & 1);
  bVar12 = (bool)(bVar101 >> 5 & 1);
  bVar13 = (bool)(bVar101 >> 6 & 1);
  local_26a0._4_4_ = (uint)bVar102 * auVar119._4_4_ | (uint)!bVar102 * local_26a0._4_4_;
  local_26a0._0_4_ =
       (uint)(bVar101 & 1) * auVar119._0_4_ | (uint)!(bool)(bVar101 & 1) * local_26a0._0_4_;
  local_26a0._8_4_ = (uint)bVar9 * auVar119._8_4_ | (uint)!bVar9 * local_26a0._8_4_;
  local_26a0._12_4_ = (uint)bVar10 * auVar119._12_4_ | (uint)!bVar10 * local_26a0._12_4_;
  local_26a0._16_4_ = (uint)bVar11 * auVar119._16_4_ | (uint)!bVar11 * local_26a0._16_4_;
  local_26a0._20_4_ = (uint)bVar12 * auVar119._20_4_ | (uint)!bVar12 * local_26a0._20_4_;
  local_26a0._24_4_ = (uint)bVar13 * auVar119._24_4_ | (uint)!bVar13 * local_26a0._24_4_;
  local_26a0._28_4_ =
       (uint)(bVar101 >> 7) * auVar119._28_4_ | (uint)!(bool)(bVar101 >> 7) * local_26a0._28_4_;
  goto LAB_01d0b092;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded(vint<K>* __restrict__ valid_i,
                                                                                              Accel::Intersectors* __restrict__ This,
                                                                                              RayK<K>& __restrict__ ray,
                                                                                              RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        occludedCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out already occluded and invalid rays */
      vbool<K> valid = (*valid_i == -1) & (ray.tfar >= 0.0f);
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      const size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
      tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));

      vbool<K> terminated = !valid;
      const vfloat<K> inf = vfloat<K>(pos_inf);

      /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      /* allocate stack and push root node */
      vfloat<K> stack_near[stackSizeChunk];
      NodeRef stack_node[stackSizeChunk];
      stack_node[0] = BVH::invalidNode;
      stack_near[0] = inf;
      stack_node[1] = bvh->root;
      stack_near[1] = tray.tnear;
      NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
      NodeRef* __restrict__ sptr_node = stack_node + 2;
      vfloat<K>* __restrict__ sptr_near = stack_near + 2;

      while (1) pop:
      {
        /* pop next node from stack */
        assert(sptr_node > stack_node);
        sptr_node--;
        sptr_near--;
        NodeRef cur = *sptr_node;
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }

        /* cull node if behind closest hit point */
        vfloat<K> curDist = *sptr_near;
        const vbool<K> active = curDist < tray.tfar;
        if (unlikely(none(active)))
          continue;

        /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
        if (single)
#endif
        {
          size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
          if (unlikely(popcnt(bits) <= switchThreshold)) 
#endif
          {
            for (; bits!=0; ) {
              const size_t i = bscf(bits);
              if (occluded1(This, bvh, cur, i, pre, ray, tray, context))
                set(terminated, i);
            }
            if (all(terminated)) break;
            tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar);
            continue;
          }
        }
#endif

        while (likely(!cur.isLeaf()))
        {
          /* process nodes */
          const vbool<K> valid_node = tray.tfar > curDist;
          STAT3(shadow.trav_nodes, 1, popcnt(valid_node), K);
          const NodeRef nodeRef = cur;
          const BaseNode* __restrict__ const node = nodeRef.baseNode();

          /* set cur to invalid */
          cur = BVH::emptyNode;
          curDist = pos_inf;

          for (unsigned i = 0; i < N; i++)
          {
            const NodeRef child = node->children[i];
            if (unlikely(child == BVH::emptyNode)) break;
            vfloat<K> lnearP;
            vbool<K> lhit = valid_node;
            BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

            /* if we hit the child we push the previously hit node onto the stack, and continue with the currently hit child */
            if (likely(any(lhit)))
            {
              assert(sptr_node < stackEnd);
              assert(child != BVH::emptyNode);
              const vfloat<K> childDist = select(lhit, lnearP, inf);

              /* push 'cur' node onto stack and continue with hit child */
              if (likely(cur != BVH::emptyNode)) {
                *sptr_node = cur; sptr_node++;
                *sptr_near = curDist; sptr_near++;
              }
              curDist = childDist;
              cur = child;
            }
          }
          if (unlikely(cur == BVH::emptyNode))
            goto pop;

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
          if (single)
          {
            // seems to be the best place for testing utilization
            if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
            {
              *sptr_node++ = cur;
              *sptr_near++ = curDist;
              goto pop;
            }
          }
#endif
	}

        /* return if stack is empty */
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }


        /* intersect leaf */
        assert(cur != BVH::emptyNode);
        const vbool<K> valid_leaf = tray.tfar > curDist;
        STAT3(shadow.trav_leaves, 1, popcnt(valid_leaf), K);
        if (unlikely(none(valid_leaf))) continue;
        size_t items; const Primitive* prim = (Primitive*) cur.leaf(items);

        size_t lazy_node = 0;
        terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
        if (all(terminated)) break;
        tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

        if (unlikely(lazy_node)) {
          *sptr_node = lazy_node; sptr_node++;
          *sptr_near = neg_inf;   sptr_near++;
        }
      }

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }